

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86.cpp
# Opt level: O0

int __thiscall
ncnn::ConvolutionDepthWise_x86::forward
          (ConvolutionDepthWise_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  long *plVar1;
  int *piVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  ulong uVar29;
  ulong uVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  undefined8 *puVar34;
  const_reference ppLVar35;
  undefined8 *in_RCX;
  void **in_RDX;
  long in_RSI;
  long *in_RDI;
  bool bVar36;
  float fVar37;
  int iVar38;
  float fVar41;
  int iVar42;
  ulong uVar39;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar47;
  float fVar48;
  float fVar49;
  ulong uVar46;
  undefined1 auVar40 [16];
  undefined1 auVar50 [16];
  Option opt_g;
  Layer *op;
  Mat top_blob_g;
  Mat bottom_blob_bordered_g;
  int g_1;
  Mat top_blob_unpacked;
  Option opt_p;
  Mat bottom_blob_bordered_unpacked;
  int out_g_elempack;
  int g_elempack;
  int num_output_g;
  int channels_g;
  __m128 _w;
  __m128 _val;
  int k;
  float *sptr;
  __m128 _sum;
  int j_1;
  int i_1;
  Mat m;
  float *kptr;
  float *outptr;
  int g;
  int j;
  int i;
  int gap;
  int p2;
  int p1;
  int *space_ofs;
  vector<int,_std::allocator<int>_> _space_ofs;
  int maxk;
  size_t out_elemsize;
  int out_elempack;
  int outh;
  int outw;
  Mat bottom_blob_bordered;
  int kernel_extent_h;
  int kernel_extent_w;
  int elempack;
  size_t elemsize;
  int channels;
  int h;
  int w;
  Mat *m_2;
  Mat *m_1;
  __m128 _b;
  __m128 _a;
  __m128 max;
  __m128 min;
  Mat *m_4;
  Mat *m_3;
  __m128 neg;
  __m128 pos;
  __m128 one;
  __m128 one_7;
  v4sf pow2n_1;
  v4sf y_1;
  v4sf mask_1;
  v4sf one_2;
  v4si emm0_1;
  v4sf fx_1;
  v4sf tmp_1;
  v4sf pow2n;
  v4sf y;
  v4sf mask;
  v4sf one_1;
  v4si emm0;
  v4sf fx;
  v4sf tmp;
  __m128 two;
  __m128 one_4;
  __m128 one_5;
  v4sf pow2n_2;
  v4sf y_3;
  v4sf mask_3;
  v4sf one_6;
  v4si emm0_3;
  v4sf fx_2;
  v4sf tmp_3;
  v4sf y_2;
  v4sf z;
  v4sf tmp_2;
  v4sf mask_2;
  v4sf e;
  v4sf invalid_mask;
  v4sf one_3;
  v4si emm0_2;
  Option *in_stack_ffffffffffffd668;
  Mat *in_stack_ffffffffffffd670;
  Mat *in_stack_ffffffffffffd678;
  void **ppvVar51;
  undefined4 in_stack_ffffffffffffd680;
  int in_stack_ffffffffffffd684;
  size_t in_stack_ffffffffffffd688;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffd690;
  Option *in_stack_ffffffffffffd698;
  Mat *in_stack_ffffffffffffd6a0;
  Mat *in_stack_ffffffffffffd6a8;
  Mat *in_stack_ffffffffffffd6b0;
  undefined7 in_stack_ffffffffffffd700;
  undefined1 in_stack_ffffffffffffd707;
  Option *local_2818;
  Mat *in_stack_ffffffffffffd7f8;
  Mat *in_stack_ffffffffffffd800;
  undefined4 in_stack_ffffffffffffd808;
  undefined4 in_stack_ffffffffffffd80c;
  undefined4 in_stack_ffffffffffffd810;
  undefined4 in_stack_ffffffffffffd814;
  Mat *in_stack_ffffffffffffd818;
  Mat *in_stack_ffffffffffffd820;
  undefined8 local_2678;
  long *plStack_2670;
  undefined8 local_2668;
  undefined8 uStack_2660;
  undefined4 local_2658;
  undefined4 uStack_2654;
  undefined4 uStack_2650;
  undefined4 uStack_264c;
  undefined8 local_2648;
  undefined8 uStack_2640;
  value_type local_2630;
  void *local_2628;
  int *local_2620;
  void *local_2618;
  undefined4 local_2610;
  long *local_2608;
  undefined4 local_2600;
  int local_25fc;
  int local_25f8;
  int local_25f4;
  int local_25f0;
  ulong local_25e8;
  void *local_25e0;
  int *local_25d8;
  ulong local_25d0;
  undefined4 local_25c8;
  long *local_25c0;
  undefined4 local_25b8;
  int local_25b4;
  int local_25b0;
  int local_25ac;
  int local_25a8;
  ulong local_25a0;
  int local_2594;
  void *local_2590;
  int *local_2588;
  void *local_2580;
  undefined4 local_2578;
  long *local_2570;
  undefined4 local_2568;
  int local_2564;
  int local_2560;
  int local_255c;
  int local_2558;
  void *local_2550;
  undefined8 local_2548;
  undefined8 uStack_2540;
  undefined8 local_2538;
  undefined8 uStack_2530;
  undefined8 local_2528;
  undefined8 uStack_2520;
  undefined8 local_2518;
  undefined8 uStack_2510;
  void *local_2500;
  int *local_24f8;
  ulong local_24f0;
  undefined4 local_24e8;
  long *local_24e0;
  undefined4 local_24d8;
  int local_24d4;
  int local_24d0;
  int local_24cc;
  undefined4 local_24c8;
  Mat *local_24c0;
  int local_24b8;
  int local_24b4;
  int local_24b0;
  int local_24ac;
  undefined8 local_24a8;
  undefined8 uStack_24a0;
  undefined8 local_2498;
  undefined8 uStack_2490;
  int local_2484;
  long local_2480;
  undefined8 local_2478;
  undefined8 uStack_2470;
  int local_2460;
  int local_245c;
  undefined8 local_2458;
  undefined8 local_2450;
  undefined8 local_2448;
  undefined4 local_2440;
  long *local_2438;
  undefined4 local_2430;
  undefined4 local_242c;
  undefined4 local_2428;
  undefined4 local_2424;
  undefined4 local_2420;
  undefined8 local_2418;
  long local_2410;
  undefined8 local_2408;
  undefined8 local_2400;
  undefined8 local_23f8;
  undefined4 local_23f0;
  void *local_23e8;
  undefined4 local_23e0;
  undefined4 local_23dc;
  undefined4 local_23d8;
  undefined4 local_23d4;
  undefined4 local_23d0;
  undefined8 local_23c8;
  void *local_23c0;
  int local_23b8;
  int local_23b4;
  int local_23b0;
  int local_23ac;
  int local_23a8;
  int local_23a4;
  reference local_23a0;
  vector<int,_std::allocator<int>_> local_2390;
  int local_2374;
  long local_2370;
  int local_2364;
  int local_2360;
  int local_235c;
  undefined4 local_2358;
  void *local_2348;
  int *local_2340;
  ulong local_2338;
  undefined4 local_2330;
  long *local_2328;
  undefined4 local_2320;
  int local_231c;
  int local_2318;
  int local_2314;
  undefined4 uVar52;
  Option *in_stack_ffffffffffffdcf0;
  Mat *_bias;
  undefined4 in_stack_ffffffffffffdd00;
  Mat *bottom_blob_00;
  int local_22b4;
  float local_2058;
  float fStack_2054;
  float fStack_2050;
  float fStack_204c;
  float local_2038;
  float fStack_2034;
  float fStack_2030;
  float fStack_202c;
  float local_2028;
  float fStack_2024;
  float fStack_2020;
  float fStack_201c;
  undefined4 in_stack_ffffffffffffe030;
  undefined4 in_stack_ffffffffffffe034;
  Mat *in_stack_ffffffffffffe038;
  Mat *in_stack_ffffffffffffe040;
  undefined1 in_stack_ffffffffffffe048 [16];
  undefined4 in_stack_ffffffffffffe3b8;
  undefined4 in_stack_ffffffffffffe3bc;
  Mat *in_stack_ffffffffffffe3c0;
  undefined4 in_stack_ffffffffffffe3c8;
  undefined4 in_stack_ffffffffffffe3cc;
  undefined4 in_stack_ffffffffffffe3d0;
  undefined4 in_stack_ffffffffffffe3d4;
  Mat *in_stack_ffffffffffffe3d8;
  float fStack_1c20;
  float fStack_1c1c;
  float local_1c18;
  float fStack_1c14;
  float fStack_1c10;
  float fStack_1c0c;
  undefined8 local_1a88;
  undefined8 uStack_1a80;
  float local_1a08;
  float fStack_1a04;
  float fStack_1a00;
  float fStack_19fc;
  undefined8 local_1958;
  undefined8 uStack_1950;
  undefined8 local_1948;
  undefined8 uStack_1940;
  undefined8 local_1938;
  undefined8 uStack_1930;
  float local_1928;
  float fStack_1924;
  float fStack_1920;
  float fStack_191c;
  float local_1918;
  float fStack_1914;
  float fStack_1910;
  float fStack_190c;
  undefined8 local_1908;
  undefined8 uStack_1900;
  undefined8 local_18f8;
  undefined8 uStack_18f0;
  undefined8 local_18e8;
  undefined8 uStack_18e0;
  undefined8 local_18d8;
  undefined8 uStack_18d0;
  undefined8 local_18c8;
  undefined8 uStack_18c0;
  undefined8 local_18b8;
  undefined8 uStack_18b0;
  undefined8 local_18a8;
  undefined8 uStack_18a0;
  undefined8 local_1898;
  undefined8 uStack_1890;
  undefined8 local_1888;
  undefined8 uStack_1880;
  undefined8 local_1878;
  undefined8 uStack_1870;
  undefined8 local_1868;
  undefined8 uStack_1860;
  undefined8 local_1858;
  undefined8 uStack_1850;
  undefined8 local_1848;
  undefined8 uStack_1840;
  undefined8 local_1838;
  undefined8 uStack_1830;
  undefined8 local_1828;
  undefined8 uStack_1820;
  undefined8 local_1818;
  undefined8 uStack_1810;
  ulong local_1808;
  ulong uStack_1800;
  undefined8 local_17f8;
  undefined8 uStack_17f0;
  undefined8 *local_17e0;
  undefined8 *local_17d8;
  undefined8 *local_17d0;
  undefined8 local_17c8;
  undefined8 uStack_17c0;
  float local_17b8;
  float fStack_17b4;
  float fStack_17b0;
  float fStack_17ac;
  undefined8 local_17a8;
  undefined8 uStack_17a0;
  undefined8 local_1798;
  undefined8 uStack_1790;
  float *local_1780;
  undefined8 *local_1778;
  undefined8 *local_1770;
  float local_1768 [2];
  float afStack_1760 [2];
  float local_1758;
  float fStack_1754;
  float fStack_1750;
  float fStack_174c;
  undefined8 local_1748;
  undefined8 uStack_1740;
  undefined8 local_1738;
  undefined8 uStack_1730;
  float *local_1720;
  undefined8 *local_1718;
  undefined8 *local_1710;
  Option *in_stack_ffffffffffffe8f8;
  Mat *in_stack_ffffffffffffe900;
  undefined4 in_stack_ffffffffffffe908;
  undefined4 in_stack_ffffffffffffe90c;
  undefined4 in_stack_ffffffffffffe910;
  undefined4 in_stack_ffffffffffffe914;
  undefined8 local_1548;
  undefined8 uStack_1540;
  undefined8 local_14f8;
  undefined8 uStack_14f0;
  Option *in_stack_ffffffffffffeb30;
  Mat *in_stack_ffffffffffffeb38;
  Mat *in_stack_ffffffffffffeb40;
  Mat *in_stack_ffffffffffffeb48;
  Mat *in_stack_ffffffffffffeb50;
  float local_1458;
  float fStack_1454;
  float fStack_1450;
  float fStack_144c;
  float local_1168;
  float fStack_1164;
  float fStack_1160;
  float fStack_115c;
  float local_1148;
  float fStack_1144;
  float fStack_1140;
  float fStack_113c;
  float local_e28;
  float fStack_e24;
  float fStack_e20;
  float fStack_e1c;
  float local_e08;
  float fStack_e04;
  float fStack_e00;
  float fStack_dfc;
  undefined8 local_d58;
  undefined8 uStack_d50;
  undefined8 local_d48;
  undefined8 uStack_d40;
  undefined8 local_d38;
  undefined8 uStack_d30;
  float local_d28;
  float fStack_d24;
  float fStack_d20;
  float fStack_d1c;
  float local_d18;
  float fStack_d14;
  float fStack_d10;
  float fStack_d0c;
  undefined8 local_d08;
  undefined8 uStack_d00;
  undefined8 local_cf8;
  undefined8 uStack_cf0;
  undefined8 local_ce8;
  undefined8 uStack_ce0;
  undefined8 local_cd8;
  undefined8 uStack_cd0;
  undefined8 local_cc8;
  undefined8 uStack_cc0;
  undefined8 local_cb8;
  undefined8 uStack_cb0;
  undefined8 local_ca8;
  undefined8 uStack_ca0;
  undefined8 local_c98;
  undefined8 uStack_c90;
  undefined8 local_c88;
  undefined8 uStack_c80;
  undefined8 local_c78;
  undefined8 uStack_c70;
  undefined8 local_c68;
  undefined8 uStack_c60;
  undefined8 local_c58;
  undefined8 uStack_c50;
  undefined8 local_c48;
  undefined8 uStack_c40;
  undefined8 local_c38;
  undefined8 uStack_c30;
  undefined8 local_c28;
  undefined8 uStack_c20;
  undefined8 local_c18;
  undefined8 uStack_c10;
  ulong local_c08;
  ulong uStack_c00;
  undefined8 local_bf8;
  undefined8 uStack_bf0;
  undefined8 *local_be0;
  undefined8 *local_bd8;
  undefined8 *local_bd0;
  undefined8 local_bc8;
  undefined8 uStack_bc0;
  float local_bb8;
  float fStack_bb4;
  float fStack_bb0;
  float fStack_bac;
  undefined8 local_ba8;
  undefined8 uStack_ba0;
  undefined8 local_b98;
  undefined8 uStack_b90;
  float *local_b80;
  undefined8 *local_b78;
  undefined8 *local_b70;
  float local_b68 [2];
  float afStack_b60 [2];
  float local_b58;
  float fStack_b54;
  float fStack_b50;
  float fStack_b4c;
  undefined8 local_b48;
  undefined8 uStack_b40;
  undefined8 local_b38;
  undefined8 uStack_b30;
  float *local_b20;
  undefined8 *local_b18;
  undefined8 *local_b10;
  float local_b08 [2];
  float afStack_b00 [2];
  float local_af8;
  float fStack_af4;
  float fStack_af0;
  float fStack_aec;
  undefined8 local_ae8;
  undefined8 uStack_ae0;
  undefined8 local_ad8;
  undefined8 uStack_ad0;
  float *local_ac0;
  undefined8 *local_ab8;
  undefined8 *local_ab0;
  float local_aa8 [2];
  float afStack_aa0 [2];
  float local_a98;
  float fStack_a94;
  float fStack_a90;
  float fStack_a8c;
  undefined8 local_a88;
  undefined8 uStack_a80;
  undefined8 local_a78;
  undefined8 uStack_a70;
  float *local_a60;
  undefined8 *local_a58;
  undefined8 *local_a50;
  float local_a48 [2];
  float afStack_a40 [2];
  float local_a38;
  float fStack_a34;
  float fStack_a30;
  float fStack_a2c;
  undefined8 local_a28;
  undefined8 uStack_a20;
  undefined8 local_a18;
  undefined8 uStack_a10;
  float *local_a00;
  undefined8 *local_9f8;
  undefined8 *local_9f0;
  float local_9e8 [2];
  float afStack_9e0 [2];
  float local_9d8;
  float fStack_9d4;
  float fStack_9d0;
  float fStack_9cc;
  undefined8 local_9c8;
  undefined8 uStack_9c0;
  undefined8 local_9b8;
  undefined8 uStack_9b0;
  undefined8 local_9a8;
  undefined8 uStack_9a0;
  undefined8 local_998;
  undefined8 uStack_990;
  undefined8 local_988;
  undefined8 uStack_980;
  undefined8 local_978;
  undefined8 uStack_970;
  undefined8 local_968;
  undefined8 uStack_960;
  undefined8 local_958;
  undefined8 uStack_950;
  undefined8 local_948;
  undefined8 uStack_940;
  undefined8 local_938;
  undefined8 uStack_930;
  undefined8 local_928;
  undefined8 uStack_920;
  float local_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  undefined8 local_908;
  undefined8 uStack_900;
  undefined8 local_8f8;
  undefined8 uStack_8f0;
  undefined8 local_8e8;
  undefined8 uStack_8e0;
  undefined8 local_8d8;
  undefined8 uStack_8d0;
  undefined8 *local_8c0;
  float *local_8b8;
  float *local_8b0;
  float local_8a8 [2];
  float afStack_8a0 [2];
  undefined8 local_898;
  undefined8 uStack_890;
  float local_888;
  float fStack_884;
  float fStack_880;
  float fStack_87c;
  undefined8 local_878;
  undefined8 uStack_870;
  undefined8 *local_860;
  float *local_858;
  float *local_850;
  float local_848 [2];
  float afStack_840 [2];
  undefined8 local_838;
  undefined8 uStack_830;
  float local_828;
  float fStack_824;
  float fStack_820;
  float fStack_81c;
  undefined8 local_818;
  undefined8 uStack_810;
  undefined4 local_7fc;
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  float local_7c8;
  float fStack_7c4;
  float fStack_7c0;
  float fStack_7bc;
  ulong local_7b8;
  ulong uStack_7b0;
  int local_7a8;
  int iStack_7a4;
  int iStack_7a0;
  int iStack_79c;
  float local_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  int local_788;
  int iStack_784;
  int iStack_780;
  int iStack_77c;
  undefined8 local_778;
  undefined8 uStack_770;
  int local_768;
  int iStack_764;
  int iStack_760;
  int iStack_75c;
  undefined8 local_758;
  undefined8 uStack_750;
  undefined8 local_748;
  undefined8 uStack_740;
  undefined8 local_738;
  undefined8 uStack_730;
  undefined8 local_728;
  undefined8 uStack_720;
  undefined8 local_718;
  undefined8 uStack_710;
  undefined8 local_708;
  undefined8 uStack_700;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  undefined8 local_698;
  undefined8 uStack_690;
  undefined8 local_688;
  undefined8 uStack_680;
  ulong local_678;
  ulong uStack_670;
  undefined8 local_668;
  undefined8 uStack_660;
  ulong local_658;
  ulong uStack_650;
  ulong local_648;
  ulong uStack_640;
  undefined8 local_638;
  undefined8 uStack_630;
  ulong local_628;
  ulong uStack_620;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 *local_600;
  float *local_5f8;
  float *local_5f0;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  float local_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float local_5c8 [2];
  float afStack_5c0 [2];
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined8 *local_5a0;
  float *local_598;
  float *local_590;
  undefined8 local_588;
  undefined8 uStack_580;
  float local_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float local_568 [2];
  float afStack_560 [2];
  undefined8 local_558;
  undefined8 uStack_550;
  float *local_540;
  undefined8 *local_538;
  undefined8 *local_530;
  float local_528 [2];
  float afStack_520 [2];
  float local_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  float *local_4e0;
  undefined8 *local_4d8;
  undefined8 *local_4d0;
  float local_4c8 [2];
  float afStack_4c0 [2];
  float local_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  float *local_480;
  undefined8 *local_478;
  undefined8 *local_470;
  float local_468 [2];
  float afStack_460 [2];
  float local_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  float *local_420;
  undefined8 *local_418;
  undefined8 *local_410;
  float local_408 [2];
  float afStack_400 [2];
  float local_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  float *local_3c0;
  undefined8 *local_3b8;
  undefined8 *local_3b0;
  float local_3a8 [2];
  float afStack_3a0 [2];
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  float *local_360;
  undefined8 *local_358;
  undefined8 *local_350;
  float local_348 [2];
  float afStack_340 [2];
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  float *local_300;
  undefined8 *local_2f8;
  undefined8 *local_2f0;
  float local_2e8 [2];
  float afStack_2e0 [2];
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  float *local_2a0;
  undefined8 *local_298;
  undefined8 *local_290;
  float local_288 [2];
  float afStack_280 [2];
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  ulong local_1f8;
  ulong uStack_1f0;
  undefined8 *local_1e0;
  float *local_1d8;
  float *local_1d0;
  float local_1c8 [2];
  float afStack_1c0 [2];
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined4 local_15c;
  undefined8 local_158;
  undefined8 uStack_150;
  ulong local_148;
  ulong uStack_140;
  ulong local_138;
  ulong uStack_130;
  ulong local_128;
  ulong uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  ulong local_108;
  ulong uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  int local_b0;
  undefined4 local_ac;
  void **local_a8;
  int local_a0;
  undefined4 local_9c;
  void **local_98;
  long *local_90;
  undefined4 local_84;
  ulong local_80;
  void *local_78;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  void **local_60;
  undefined4 local_54;
  long local_50;
  undefined4 local_3c;
  void *local_38;
  void *local_30;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  void **local_18;
  undefined4 local_c;
  long local_8;
  
  if (((*(byte *)((long)in_RCX + 0x1e) & 1) != 0) &&
     (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x10c) != 0)) {
    iVar31 = forward_int8_x86((ConvolutionDepthWise_x86 *)
                              CONCAT44(in_stack_ffffffffffffe914,in_stack_ffffffffffffe910),
                              (Mat *)CONCAT44(in_stack_ffffffffffffe90c,in_stack_ffffffffffffe908),
                              in_stack_ffffffffffffe900,in_stack_ffffffffffffe8f8);
    return iVar31;
  }
  iVar31 = *(int *)(in_RSI + 0x38);
  bottom_blob_00 = *(Mat **)(in_RSI + 0x10);
  iVar38 = *(int *)(in_RSI + 0x18);
  iVar32 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) *
           (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) + -1) + 1;
  iVar33 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) *
           (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) + -1) + 1;
  local_2348 = (void *)0x0;
  local_2340 = (int *)0x0;
  local_2338 = 0;
  local_2330 = 0;
  local_2328 = (long *)0x0;
  local_2320 = 0;
  local_231c = 0;
  local_2318 = 0;
  local_2314 = 0;
  uVar52 = 0;
  _bias = (Mat *)0x0;
  ConvolutionDepthWise::make_padding
            ((ConvolutionDepthWise *)CONCAT44(in_stack_ffffffffffffd684,in_stack_ffffffffffffd680),
             in_stack_ffffffffffffd678,in_stack_ffffffffffffd670,in_stack_ffffffffffffd668);
  iVar42 = local_231c;
  if (local_2348 == (void *)0x0 || (long)_bias * (long)(int)in_stack_ffffffffffffdcf0 == 0) {
    local_22b4 = -100;
    local_2358 = 1;
  }
  else {
    local_235c = (local_231c - iVar32) / *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4)
                 + 1;
    local_2360 = (local_2318 - iVar33) / *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8)
                 + 1;
    local_2364 = 1;
    if (((*(byte *)((long)in_RCX + 0x27) & 1) != 0) &&
       (local_2364 = 1, *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) % 4 == 0)) {
      local_2364 = 4;
    }
    local_2370 = ((ulong)bottom_blob_00 / (ulong)(long)iVar38) * (long)local_2364;
    Mat::create(in_stack_ffffffffffffd6a0,(int)((ulong)in_stack_ffffffffffffd698 >> 0x20),
                (int)in_stack_ffffffffffffd698,(int)((ulong)in_stack_ffffffffffffd690 >> 0x20),
                in_stack_ffffffffffffd688,in_stack_ffffffffffffd684,
                (Allocator *)CONCAT17(in_stack_ffffffffffffd707,in_stack_ffffffffffffd700));
    bVar36 = true;
    if (*in_RDX != (void *)0x0) {
      bVar36 = (long)in_RDX[8] * (long)*(int *)(in_RDX + 7) == 0;
    }
    if (bVar36) {
      local_22b4 = -100;
      local_2358 = 1;
    }
    else {
      if ((iVar31 * iVar38 == *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x108)) &&
         (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x108) ==
          *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0))) {
        if (iVar38 == 4) {
          if (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 3) &&
              (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) == 3)) &&
             ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) == 1 &&
              (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 1 &&
                (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 1)) &&
               (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) == 1)))))) {
            convdw3x3s1_pack4_sse
                      (in_stack_ffffffffffffeb50,in_stack_ffffffffffffeb48,in_stack_ffffffffffffeb40
                       ,in_stack_ffffffffffffeb38,in_stack_ffffffffffffeb30);
            if (in_RDI[1] != 0) {
              (**(code **)(*(long *)in_RDI[1] + 0x48))((long *)in_RDI[1],in_RDX,in_RCX);
            }
            local_22b4 = 0;
            local_2358 = 1;
          }
          else if (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 3) &&
                   (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) == 3)) &&
                  ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) == 1 &&
                   (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 1 &&
                     (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 2)) &&
                    (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) == 2)))))) {
            convdw3x3s2_pack4_sse
                      (in_stack_ffffffffffffe048._8_8_,in_stack_ffffffffffffe048._0_8_,
                       in_stack_ffffffffffffe040,in_stack_ffffffffffffe038,
                       (Option *)CONCAT44(in_stack_ffffffffffffe034,in_stack_ffffffffffffe030));
            if (in_RDI[1] != 0) {
              (**(code **)(*(long *)in_RDI[1] + 0x48))((long *)in_RDI[1],in_RDX,in_RCX);
            }
            local_22b4 = 0;
            local_2358 = 1;
          }
          else if (((((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 5) &&
                     (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) == 5)) &&
                    (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) == 1)) &&
                   ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 1 &&
                    (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 1)))) &&
                  (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) == 1)) {
            convdw5x5s1_pack4_sse
                      (in_stack_ffffffffffffe3d8,
                       (Mat *)CONCAT44(in_stack_ffffffffffffe3d4,in_stack_ffffffffffffe3d0),
                       (Mat *)CONCAT44(in_stack_ffffffffffffe3cc,in_stack_ffffffffffffe3c8),
                       in_stack_ffffffffffffe3c0,
                       (Option *)CONCAT44(in_stack_ffffffffffffe3bc,in_stack_ffffffffffffe3b8));
            if (in_RDI[1] != 0) {
              (**(code **)(*(long *)in_RDI[1] + 0x48))((long *)in_RDI[1],in_RDX,in_RCX);
            }
            local_22b4 = 0;
            local_2358 = 1;
          }
          else if (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 5) &&
                   (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) == 5)) &&
                  ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) == 1 &&
                   (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 1 &&
                     (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 2)) &&
                    (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) == 2)))))) {
            convdw5x5s2_pack4_sse
                      (bottom_blob_00,(Mat *)CONCAT44(4,iVar32),
                       (Mat *)CONCAT44(iVar33,in_stack_ffffffffffffdd00),_bias,
                       in_stack_ffffffffffffdcf0);
            if (in_RDI[1] != 0) {
              (**(code **)(*(long *)in_RDI[1] + 0x48))((long *)in_RDI[1],in_RDX,in_RCX);
            }
            local_22b4 = 0;
            local_2358 = 1;
          }
          else {
            local_2374 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) *
                         *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8);
            std::allocator<int>::allocator((allocator<int> *)0x1259b7e);
            std::vector<int,_std::allocator<int>_>::vector
                      (in_stack_ffffffffffffd690,in_stack_ffffffffffffd688,
                       (allocator_type *)
                       CONCAT44(in_stack_ffffffffffffd684,in_stack_ffffffffffffd680));
            std::allocator<int>::~allocator((allocator<int> *)0x1259baa);
            local_23a0 = std::vector<int,_std::allocator<int>_>::operator[](&local_2390,0);
            local_23a4 = 0;
            local_23a8 = 0;
            local_23ac = iVar42 * *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) -
                         *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) *
                         *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc);
            for (local_23b0 = 0;
                local_23b0 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8);
                local_23b0 = local_23b0 + 1) {
              for (local_23b4 = 0;
                  local_23b4 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
                  local_23b4 = local_23b4 + 1) {
                local_23a0[local_23a4] = local_23a8;
                local_23a4 = local_23a4 + 1;
                local_23a8 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) + local_23a8
                ;
              }
              local_23a8 = local_23ac + local_23a8;
            }
            for (local_23b8 = 0; local_23b8 < iVar31; local_23b8 = local_23b8 + 1) {
              local_23c0 = (void *)((long)*in_RDX +
                                   (long)in_RDX[8] * (long)local_23b8 * (long)in_RDX[2]);
              local_23e8 = in_RDX[4];
              local_2408 = 0;
              local_23f8 = 0;
              local_23f0 = 0;
              local_23dc = 0;
              local_23d8 = 0;
              local_23d4 = 0;
              local_23d0 = 0;
              local_2400 = 0;
              local_2410 = in_RDI[5] + (long)(local_2374 * local_23b8 * 4) * 4;
              local_2438 = local_2328;
              local_23c8 = 0;
              local_23e0 = 0;
              for (local_245c = 0; local_245c < local_2360; local_245c = local_245c + 1) {
                for (local_2460 = 0; local_2460 < local_235c; local_2460 = local_2460 + 1) {
                  local_2478 = 0;
                  uStack_2470 = 0;
                  if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x100) != 0) {
                    puVar34 = (undefined8 *)
                              (*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1b0) +
                              (long)(local_23b8 << 2) * 4);
                    local_2478 = *puVar34;
                    uStack_2470 = puVar34[1];
                  }
                  local_2480 = (long)local_2348 +
                               (long)(local_2460 *
                                      *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) * 4
                                     ) * 4 +
                               (long)local_231c *
                               (long)(local_245c *
                                     *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8)) *
                               local_2338 + (long)_bias * (long)local_23b8 * local_2338;
                  local_2484 = 0;
                  while( true ) {
                    local_2058 = (float)local_2478;
                    fStack_2054 = (float)((ulong)local_2478 >> 0x20);
                    fStack_2050 = (float)uStack_2470;
                    fStack_204c = (float)((ulong)uStack_2470 >> 0x20);
                    if (local_2374 <= local_2484) break;
                    puVar34 = (undefined8 *)(local_2480 + (long)(local_23a0[local_2484] << 2) * 4);
                    local_2498 = *puVar34;
                    uStack_2490 = puVar34[1];
                    puVar34 = (undefined8 *)(local_2410 + (long)(local_2484 << 2) * 4);
                    local_24a8 = *puVar34;
                    uStack_24a0 = puVar34[1];
                    local_2028 = (float)local_2498;
                    fStack_2024 = (float)((ulong)local_2498 >> 0x20);
                    fStack_2020 = (float)uStack_2490;
                    fStack_201c = (float)((ulong)uStack_2490 >> 0x20);
                    local_2038 = (float)local_24a8;
                    fStack_2034 = (float)((ulong)local_24a8 >> 0x20);
                    fStack_2030 = (float)uStack_24a0;
                    fStack_202c = (float)((ulong)uStack_24a0 >> 0x20);
                    local_2478 = CONCAT44(fStack_2024 * fStack_2034 + fStack_2054,
                                          local_2028 * local_2038 + local_2058);
                    uStack_2470 = CONCAT44(fStack_201c * fStack_202c + fStack_204c,
                                           fStack_2020 * fStack_2030 + fStack_2050);
                    local_2484 = local_2484 + 1;
                  }
                  plVar1 = (long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x118);
                  switch(*(undefined4 *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x110)) {
                  case 1:
                    auVar4._8_8_ = uStack_2470;
                    auVar4._0_8_ = local_2478;
                    auVar40 = maxps(auVar4,ZEXT816(0));
                    break;
                  case 2:
                    fVar37 = *(float *)*plVar1;
                    auVar7._8_8_ = uStack_2470;
                    auVar7._0_8_ = local_2478;
                    auVar50 = maxps(ZEXT816(0),auVar7);
                    auVar8._8_8_ = uStack_2470;
                    auVar8._0_8_ = local_2478;
                    auVar40 = minps(ZEXT816(0),auVar8);
                    local_1c18 = auVar40._0_4_;
                    fStack_1c14 = auVar40._4_4_;
                    fStack_1c10 = auVar40._8_4_;
                    fStack_1c0c = auVar40._12_4_;
                    fStack_1c20 = auVar50._8_4_;
                    fStack_1c1c = auVar50._12_4_;
                    auVar40._4_4_ = auVar50._4_4_ + fVar37 * fStack_1c14;
                    auVar40._0_4_ = auVar50._0_4_ + fVar37 * local_1c18;
                    auVar40._12_4_ = fStack_1c1c + fVar37 * fStack_1c0c;
                    auVar40._8_4_ = fStack_1c20 + fVar37 * fStack_1c10;
                    break;
                  case 3:
                    uVar52 = *(undefined4 *)*plVar1;
                    auVar5._4_4_ = uVar52;
                    auVar5._0_4_ = uVar52;
                    auVar5._12_4_ = uVar52;
                    auVar5._8_4_ = uVar52;
                    uVar52 = *(undefined4 *)(*plVar1 + 4);
                    auVar9._4_4_ = uVar52;
                    auVar9._0_4_ = uVar52;
                    auVar9._12_4_ = uVar52;
                    auVar9._8_4_ = uVar52;
                    auVar6._8_8_ = uStack_2470;
                    auVar6._0_8_ = local_2478;
                    auVar40 = maxps(auVar6,auVar5);
                    auVar40 = minps(auVar40,auVar9);
                    break;
                  case 4:
                    local_14f8 = CONCAT44(0.0 - fStack_2054,0.0 - local_2058);
                    uStack_14f0._0_4_ = 0.0 - fStack_2050;
                    uStack_14f0._4_4_ = 0.0 - fStack_204c;
                    auVar17._8_8_ = uStack_14f0;
                    auVar17._0_8_ = local_14f8;
                    auVar16._8_8_ = 0x42b0c0a542b0c0a5;
                    auVar16._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar40 = minps(auVar17,auVar16);
                    auVar15._8_8_ = 0xc2b0c0a5c2b0c0a5;
                    auVar15._0_8_ = 0xc2b0c0a5c2b0c0a5;
                    auVar40 = maxps(auVar40,auVar15);
                    local_1458 = auVar40._0_4_;
                    fStack_1454 = auVar40._4_4_;
                    fStack_1450 = auVar40._8_4_;
                    fStack_144c = auVar40._12_4_;
                    fVar37 = local_1458 * 1.442695 + 0.5;
                    fVar45 = fStack_1454 * 1.442695 + 0.5;
                    fVar43 = fStack_1450 * 1.442695 + 0.5;
                    fVar47 = fStack_144c * 1.442695 + 0.5;
                    fVar41 = (float)(int)fVar37;
                    fVar49 = (float)(int)fVar45;
                    fVar44 = (float)(int)fVar43;
                    fVar48 = (float)(int)fVar47;
                    local_1548 = CONCAT44(-(uint)(fVar45 < fVar49),-(uint)(fVar37 < fVar41));
                    uStack_1540 = CONCAT44(-(uint)(fVar47 < fVar48),-(uint)(fVar43 < fVar44));
                    local_1168 = (float)(local_1548 & 0x3f8000003f800000);
                    fStack_1164 = (float)((local_1548 & 0x3f8000003f800000) >> 0x20);
                    fStack_1160 = (float)(uStack_1540 & 0x3f8000003f800000);
                    fStack_115c = (float)((uStack_1540 & 0x3f8000003f800000) >> 0x20);
                    fVar41 = fVar41 - local_1168;
                    fVar49 = fVar49 - fStack_1164;
                    fVar44 = fVar44 - fStack_1160;
                    fVar48 = fVar48 - fStack_115c;
                    fVar37 = (local_1458 - fVar41 * 0.6933594) - fVar41 * -0.00021219444;
                    fVar45 = (fStack_1454 - fVar49 * 0.6933594) - fVar49 * -0.00021219444;
                    fVar43 = (fStack_1450 - fVar44 * 0.6933594) - fVar44 * -0.00021219444;
                    fVar47 = (fStack_144c - fVar48 * 0.6933594) - fVar48 * -0.00021219444;
                    auVar3._8_8_ = 0x3f8000003f800000;
                    auVar3._0_8_ = 0x3f8000003f800000;
                    auVar11._4_4_ =
                         ((((((fVar45 * 0.00019875691 + 0.0013981999) * fVar45 + 0.008333452) *
                             fVar45 + 0.041665796) * fVar45 + 0.16666666) * fVar45 + 0.5) *
                          fVar45 * fVar45 + fVar45 + 1.0) * (float)((int)fVar49 + 0x7f) + 1.0;
                    auVar11._0_4_ =
                         ((((((fVar37 * 0.00019875691 + 0.0013981999) * fVar37 + 0.008333452) *
                             fVar37 + 0.041665796) * fVar37 + 0.16666666) * fVar37 + 0.5) *
                          fVar37 * fVar37 + fVar37 + 1.0) * (float)(((int)fVar41 + 0x7f) * 0x800000)
                         + 1.0;
                    auVar11._8_4_ =
                         ((((((fVar43 * 0.00019875691 + 0.0013981999) * fVar43 + 0.008333452) *
                             fVar43 + 0.041665796) * fVar43 + 0.16666666) * fVar43 + 0.5) *
                          fVar43 * fVar43 + fVar43 + 1.0) * (float)((int)fVar44 + 0x7f) + 1.0;
                    auVar11._12_4_ =
                         ((((((fVar47 * 0.00019875691 + 0.0013981999) * fVar47 + 0.008333452) *
                             fVar47 + 0.041665796) * fVar47 + 0.16666666) * fVar47 + 0.5) *
                          fVar47 * fVar47 + fVar47 + 1.0) * (float)((int)fVar48 + 0x7f) + 1.0;
                    auVar40 = divps(auVar3,auVar11);
                    break;
                  case 5:
                    local_1828 = 0;
                    uStack_1820 = 0;
                    local_1938 = 0x3f8000003f800000;
                    uStack_1930 = 0x3f8000003f800000;
                    auVar14._8_8_ = uStack_2470;
                    auVar14._0_8_ = local_2478;
                    auVar13._8_8_ = 0x42b0c0a542b0c0a5;
                    auVar13._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar40 = minps(auVar14,auVar13);
                    auVar12._8_8_ = 0xc2b0c0a5c2b0c0a5;
                    auVar12._0_8_ = 0xc2b0c0a5c2b0c0a5;
                    auVar40 = maxps(auVar40,auVar12);
                    local_18f8 = auVar40._0_8_;
                    uStack_18f0 = auVar40._8_8_;
                    local_1858 = local_18f8;
                    uVar25 = local_1858;
                    uStack_1850 = uStack_18f0;
                    uVar26 = uStack_1850;
                    local_1868 = 0x3fb8aa3b3fb8aa3b;
                    uStack_1860 = 0x3fb8aa3b3fb8aa3b;
                    local_1858._0_4_ = auVar40._0_4_;
                    local_1858._4_4_ = auVar40._4_4_;
                    uStack_1850._0_4_ = auVar40._8_4_;
                    uStack_1850._4_4_ = auVar40._12_4_;
                    local_18b8 = CONCAT44(local_1858._4_4_ * 1.442695,(float)local_1858 * 1.442695);
                    uStack_18b0 = CONCAT44(uStack_1850._4_4_ * 1.442695,
                                           (float)uStack_1850 * 1.442695);
                    local_18c8 = 0x3f0000003f000000;
                    uStack_18c0 = 0x3f0000003f000000;
                    fVar37 = (float)local_1858 * 1.442695 + 0.5;
                    fVar41 = local_1858._4_4_ * 1.442695 + 0.5;
                    fVar45 = (float)uStack_1850 * 1.442695 + 0.5;
                    fVar49 = uStack_1850._4_4_ * 1.442695 + 0.5;
                    iVar38 = (int)fVar37;
                    iVar42 = (int)fVar41;
                    iVar32 = (int)fVar45;
                    iVar33 = (int)fVar49;
                    local_17f8 = CONCAT44(iVar42,iVar38);
                    uStack_17f0 = CONCAT44(iVar33,iVar32);
                    local_1918 = (float)iVar38;
                    fStack_1914 = (float)iVar42;
                    fStack_1910 = (float)iVar32;
                    fStack_190c = (float)iVar33;
                    local_1948 = CONCAT44(-(uint)(fVar41 < fStack_1914),-(uint)(fVar37 < local_1918)
                                         );
                    uStack_1940 = CONCAT44(-(uint)(fVar49 < fStack_190c),
                                           -(uint)(fVar45 < fStack_1910));
                    local_1808 = local_1948;
                    uStack_1800 = uStack_1940;
                    local_1818 = 0x3f8000003f800000;
                    uStack_1810 = 0x3f8000003f800000;
                    local_1948 = local_1948 & 0x3f8000003f800000;
                    uStack_1940 = uStack_1940 & 0x3f8000003f800000;
                    local_1148 = (float)local_1948;
                    fStack_1144 = (float)(local_1948 >> 0x20);
                    fStack_1140 = (float)uStack_1940;
                    fStack_113c = (float)(uStack_1940 >> 0x20);
                    local_1918 = local_1918 - local_1148;
                    fStack_1914 = fStack_1914 - fStack_1144;
                    fStack_1910 = fStack_1910 - fStack_1140;
                    fStack_190c = fStack_190c - fStack_113c;
                    fVar37 = ((float)local_1858 - local_1918 * 0.6933594) -
                             local_1918 * -0.00021219444;
                    fVar41 = (local_1858._4_4_ - fStack_1914 * 0.6933594) -
                             fStack_1914 * -0.00021219444;
                    fVar45 = ((float)uStack_1850 - fStack_1910 * 0.6933594) -
                             fStack_1910 * -0.00021219444;
                    fVar49 = (uStack_1850._4_4_ - fStack_190c * 0.6933594) -
                             fStack_190c * -0.00021219444;
                    local_1888 = CONCAT44(fVar41,fVar37);
                    uStack_1880 = CONCAT44(fVar49,fVar45);
                    uStack_18f0 = uStack_1880;
                    local_18f8 = local_1888;
                    local_1908 = CONCAT44(fVar41 * fVar41,fVar37 * fVar37);
                    uStack_1900 = CONCAT44(fVar49 * fVar49,fVar45 * fVar45);
                    local_17d0 = &local_1958;
                    local_17e0 = &local_18f8;
                    local_1720 = ::_ps_cephes_exp_p4;
                    local_1758 = (((fVar37 * 0.00019875691 + 0.0013981999) * fVar37 + 0.008333452) *
                                  fVar37 + 0.041665796) * fVar37 + 0.16666666;
                    fStack_1754 = (((fVar41 * 0.00019875691 + 0.0013981999) * fVar41 + 0.008333452)
                                   * fVar41 + 0.041665796) * fVar41 + 0.16666666;
                    fStack_1750 = (((fVar45 * 0.00019875691 + 0.0013981999) * fVar45 + 0.008333452)
                                   * fVar45 + 0.041665796) * fVar45 + 0.16666666;
                    fStack_174c = (((fVar49 * 0.00019875691 + 0.0013981999) * fVar49 + 0.008333452)
                                   * fVar49 + 0.041665796) * fVar49 + 0.16666666;
                    local_1958 = CONCAT44(fStack_1754,local_1758);
                    uStack_1950 = CONCAT44(fStack_174c,fStack_1750);
                    local_1780 = ::_ps_cephes_exp_p5;
                    local_1738 = local_1958;
                    uStack_1730 = uStack_1950;
                    local_1758 = local_1758 * fVar37;
                    fStack_1754 = fStack_1754 * fVar41;
                    fStack_1750 = fStack_1750 * fVar45;
                    fStack_174c = fStack_174c * fVar49;
                    local_1768[0] = 0.5;
                    local_1768[1] = 0.5;
                    afStack_1760[0] = 0.5;
                    afStack_1760[1] = 0.5;
                    local_1958 = CONCAT44(fStack_1754 + 0.5,local_1758 + 0.5);
                    uStack_1950 = CONCAT44(fStack_174c + 0.5,fStack_1750 + 0.5);
                    local_17d8 = &local_1908;
                    local_1798 = local_1958;
                    uStack_1790 = uStack_1950;
                    local_17a8 = local_1908;
                    uStack_17a0 = uStack_1900;
                    local_17b8 = (local_1758 + 0.5) * fVar37 * fVar37;
                    fStack_17b4 = (fStack_1754 + 0.5) * fVar41 * fVar41;
                    fStack_17b0 = (fStack_1750 + 0.5) * fVar45 * fVar45;
                    fStack_17ac = (fStack_174c + 0.5) * fVar49 * fVar49;
                    local_1958 = CONCAT44(fStack_17b4 + fVar41,local_17b8 + fVar37);
                    uStack_1950 = CONCAT44(fStack_17ac + fVar49,fStack_17b0 + fVar45);
                    local_18d8 = local_1958;
                    uStack_18d0 = uStack_1950;
                    local_18e8 = 0x3f8000003f800000;
                    uStack_18e0 = 0x3f8000003f800000;
                    fVar37 = local_17b8 + fVar37 + 1.0;
                    fVar41 = fStack_17b4 + fVar41 + 1.0;
                    fVar45 = fStack_17b0 + fVar45 + 1.0;
                    fVar49 = fStack_17ac + fVar49 + 1.0;
                    local_1958 = CONCAT44(fVar41,fVar37);
                    uStack_1950 = CONCAT44(fVar49,fVar45);
                    local_1838 = CONCAT44((int)fStack_1914,(int)local_1918);
                    uStack_1830 = CONCAT44((int)fStack_190c,(int)fStack_1910);
                    local_1848 = 0x7f0000007f;
                    uStack_1840 = 0x7f0000007f;
                    fStack_1924 = (float)((int)fStack_1914 + 0x7f);
                    fStack_1920 = (float)((int)fStack_1910 + 0x7f);
                    fStack_191c = (float)((int)fStack_190c + 0x7f);
                    local_1928 = (float)(((int)local_1918 + 0x7f) * 0x800000);
                    local_18a8 = CONCAT44(fStack_1924,local_1928);
                    uStack_18a0 = CONCAT44(fStack_191c,fStack_1920);
                    local_1898 = local_1958;
                    uStack_1890 = uStack_1950;
                    fVar37 = fVar37 * local_1928;
                    fVar41 = fVar41 * fStack_1924;
                    fVar45 = fVar45 * fStack_1920;
                    fVar49 = fVar49 * fStack_191c;
                    local_1958 = CONCAT44(fVar41,fVar37);
                    uStack_1950 = CONCAT44(fVar49,fVar45);
                    fVar37 = fVar37 + 1.0;
                    fVar41 = fVar41 + 1.0;
                    fVar45 = fVar45 + 1.0;
                    fVar49 = fVar49 + 1.0;
                    local_758 = CONCAT44(fVar41,fVar37);
                    uStack_750._0_4_ = fVar45;
                    uStack_750._4_4_ = fVar49;
                    local_778 = 0x3f8000003f800000;
                    uStack_770 = 0x3f8000003f800000;
                    local_688 = 0;
                    uStack_680 = 0;
                    local_178 = local_758;
                    uStack_170 = uStack_750;
                    local_188 = 0;
                    uStack_180 = 0;
                    local_788 = -(uint)(fVar37 <= 0.0);
                    iStack_784 = -(uint)(fVar41 <= 0.0);
                    iStack_780 = -(uint)(fVar45 <= 0.0);
                    iStack_77c = -(uint)(fVar49 <= 0.0);
                    local_238 = local_758;
                    uStack_230 = uStack_750;
                    local_248 = 0x80000000800000;
                    uStack_240 = 0x80000000800000;
                    auVar24._8_8_ = uStack_750;
                    auVar24._0_8_ = local_758;
                    auVar23._8_8_ = 0x80000000800000;
                    auVar23._0_8_ = 0x80000000800000;
                    auVar40 = maxps(auVar24,auVar23);
                    local_758 = auVar40._0_8_;
                    uStack_750 = auVar40._8_8_;
                    local_148 = local_758;
                    uStack_140 = uStack_750;
                    local_158 = local_758;
                    uVar29 = local_158;
                    uStack_150 = uStack_750;
                    uVar30 = uStack_150;
                    local_15c = 0x17;
                    local_158._0_4_ = auVar40._0_4_;
                    local_158._4_4_ = auVar40._4_4_;
                    uStack_150._0_4_ = auVar40._8_4_;
                    uStack_150._4_4_ = auVar40._12_4_;
                    local_628 = local_758;
                    uStack_620 = uStack_750;
                    local_638 = 0x807fffff807fffff;
                    uStack_630 = 0x807fffff807fffff;
                    local_108 = local_758 & 0x807fffff807fffff;
                    uStack_100 = uStack_750 & 0x807fffff807fffff;
                    local_118 = 0x3f0000003f000000;
                    uStack_110 = 0x3f0000003f000000;
                    local_648 = local_108 | 0x3f0000003f000000;
                    uStack_640 = uStack_100 | 0x3f0000003f000000;
                    local_e8 = CONCAT44(local_158._4_4_ >> 0x17,(uint)local_158 >> 0x17);
                    uStack_e0 = CONCAT44(uStack_150._4_4_ >> 0x17,(uint)uStack_150 >> 0x17);
                    local_f8 = 0x7f0000007f;
                    uStack_f0 = 0x7f0000007f;
                    local_768 = ((uint)local_158 >> 0x17) - 0x7f;
                    iStack_764 = (local_158._4_4_ >> 0x17) - 0x7f;
                    iStack_760 = ((uint)uStack_150 >> 0x17) - 0x7f;
                    iStack_75c = (uStack_150._4_4_ >> 0x17) - 0x7f;
                    local_618 = CONCAT44(iStack_764,local_768);
                    uStack_610 = CONCAT44(iStack_75c,iStack_760);
                    local_6f8 = CONCAT44((float)iStack_764,(float)local_768);
                    uStack_6f0 = CONCAT44((float)iStack_75c,(float)iStack_760);
                    local_708 = 0x3f8000003f800000;
                    uStack_700 = 0x3f8000003f800000;
                    local_798 = (float)local_768 + 1.0;
                    fStack_794 = (float)iStack_764 + 1.0;
                    fStack_790 = (float)iStack_760 + 1.0;
                    fStack_78c = (float)iStack_75c + 1.0;
                    local_d8 = 0x3f3504f33f3504f3;
                    uStack_d0 = 0x3f3504f33f3504f3;
                    local_c8._0_4_ = (float)local_648;
                    local_c8._4_4_ = (float)(local_648 >> 0x20);
                    uStack_c0._0_4_ = (float)uStack_640;
                    uStack_c0._4_4_ = (float)(uStack_640 >> 0x20);
                    local_7a8 = -(uint)((float)local_c8 < 0.70710677);
                    iStack_7a4 = -(uint)(local_c8._4_4_ < 0.70710677);
                    iStack_7a0 = -(uint)((float)uStack_c0 < 0.70710677);
                    iStack_79c = -(uint)(uStack_c0._4_4_ < 0.70710677);
                    local_658 = CONCAT44(iStack_7a4,local_7a8);
                    uStack_650 = CONCAT44(iStack_79c,iStack_7a0);
                    local_7b8 = local_648 & local_658;
                    uStack_7b0 = uStack_640 & uStack_650;
                    local_208 = 0x3f8000003f800000;
                    uStack_200 = 0x3f8000003f800000;
                    local_758 = CONCAT44(local_c8._4_4_ - 1.0,(float)local_c8 - 1.0);
                    uStack_750._0_4_ = (float)uStack_c0 - 1.0;
                    uStack_750._4_4_ = uStack_c0._4_4_ - 1.0;
                    local_218 = CONCAT44(fStack_794,local_798);
                    uStack_210 = CONCAT44(fStack_78c,fStack_790);
                    local_678 = CONCAT44(iStack_7a4,local_7a8);
                    uStack_670 = CONCAT44(iStack_79c,iStack_7a0);
                    local_668 = 0x3f8000003f800000;
                    uStack_660 = 0x3f8000003f800000;
                    uVar39 = local_678 & 0x3f8000003f800000;
                    uVar46 = uStack_670 & 0x3f8000003f800000;
                    local_228._0_4_ = (float)uVar39;
                    local_228._4_4_ = (float)(uVar39 >> 0x20);
                    uStack_220._0_4_ = (float)uVar46;
                    uStack_220._4_4_ = (float)(uVar46 >> 0x20);
                    local_798 = local_798 - (float)local_228;
                    fStack_794 = fStack_794 - local_228._4_4_;
                    fStack_790 = fStack_790 - (float)uStack_220;
                    fStack_78c = fStack_78c - uStack_220._4_4_;
                    local_718 = local_758;
                    uStack_710 = uStack_750;
                    local_728._0_4_ = (float)local_7b8;
                    local_728._4_4_ = (float)(local_7b8 >> 0x20);
                    uStack_720._0_4_ = (float)uStack_7b0;
                    uStack_720._4_4_ = (float)(uStack_7b0 >> 0x20);
                    local_728._0_4_ = ((float)local_c8 - 1.0) + (float)local_728;
                    local_728._4_4_ = (local_c8._4_4_ - 1.0) + local_728._4_4_;
                    uStack_720._0_4_ = ((float)uStack_c0 - 1.0) + (float)uStack_720;
                    uStack_720._4_4_ = (uStack_c0._4_4_ - 1.0) + uStack_720._4_4_;
                    local_758 = CONCAT44(local_728._4_4_,(float)local_728);
                    uStack_750._0_4_ = (float)uStack_720;
                    uStack_750._4_4_ = uStack_720._4_4_;
                    local_698 = local_758;
                    uStack_690 = uStack_750;
                    local_6a8 = local_758;
                    uStack_6a0 = uStack_750;
                    local_7c8 = (float)local_728 * (float)local_728;
                    fStack_7c4 = local_728._4_4_ * local_728._4_4_;
                    fStack_7c0 = (float)uStack_720 * (float)uStack_720;
                    fStack_7bc = uStack_720._4_4_ * uStack_720._4_4_;
                    local_290 = &local_7d8;
                    local_298 = &local_758;
                    local_2a0 = ::_ps_cephes_log_p1;
                    local_258 = 0x3d9021bb3d9021bb;
                    uStack_250 = 0x3d9021bb3d9021bb;
                    local_268 = local_758;
                    uStack_260 = uStack_750;
                    local_278 = (float)local_728 * 0.070376836;
                    fStack_274 = local_728._4_4_ * 0.070376836;
                    fStack_270 = (float)uStack_720 * 0.070376836;
                    fStack_26c = uStack_720._4_4_ * 0.070376836;
                    local_288[0] = -0.1151461;
                    local_288[1] = -0.1151461;
                    afStack_280[0] = -0.1151461;
                    afStack_280[1] = -0.1151461;
                    local_7d8 = CONCAT44(fStack_274 + -0.1151461,local_278 + -0.1151461);
                    uStack_7d0 = CONCAT44(fStack_26c + -0.1151461,fStack_270 + -0.1151461);
                    local_2f0 = &local_7d8;
                    local_2f8 = &local_758;
                    local_300 = ::_ps_cephes_log_p2;
                    local_2b8 = local_7d8;
                    uStack_2b0 = uStack_7d0;
                    local_2c8 = local_758;
                    uStack_2c0 = uStack_750;
                    local_2d8 = (local_278 + -0.1151461) * (float)local_728;
                    fStack_2d4 = (fStack_274 + -0.1151461) * local_728._4_4_;
                    fStack_2d0 = (fStack_270 + -0.1151461) * (float)uStack_720;
                    fStack_2cc = (fStack_26c + -0.1151461) * uStack_720._4_4_;
                    local_2e8[0] = 0.116769984;
                    local_2e8[1] = 0.116769984;
                    afStack_2e0[0] = 0.116769984;
                    afStack_2e0[1] = 0.116769984;
                    local_7d8 = CONCAT44(fStack_2d4 + 0.116769984,local_2d8 + 0.116769984);
                    uStack_7d0 = CONCAT44(fStack_2cc + 0.116769984,fStack_2d0 + 0.116769984);
                    local_350 = &local_7d8;
                    local_358 = &local_758;
                    local_360 = ::_ps_cephes_log_p3;
                    local_318 = local_7d8;
                    uStack_310 = uStack_7d0;
                    local_328 = local_758;
                    uStack_320 = uStack_750;
                    local_338 = (local_2d8 + 0.116769984) * (float)local_728;
                    fStack_334 = (fStack_2d4 + 0.116769984) * local_728._4_4_;
                    fStack_330 = (fStack_2d0 + 0.116769984) * (float)uStack_720;
                    fStack_32c = (fStack_2cc + 0.116769984) * uStack_720._4_4_;
                    local_348[0] = -0.12420141;
                    local_348[1] = -0.12420141;
                    afStack_340[0] = -0.12420141;
                    afStack_340[1] = -0.12420141;
                    local_7d8 = CONCAT44(fStack_334 + -0.12420141,local_338 + -0.12420141);
                    uStack_7d0 = CONCAT44(fStack_32c + -0.12420141,fStack_330 + -0.12420141);
                    local_3b0 = &local_7d8;
                    local_3b8 = &local_758;
                    local_3c0 = ::_ps_cephes_log_p4;
                    local_378 = local_7d8;
                    uStack_370 = uStack_7d0;
                    local_388 = local_758;
                    uStack_380 = uStack_750;
                    local_398 = (local_338 + -0.12420141) * (float)local_728;
                    fStack_394 = (fStack_334 + -0.12420141) * local_728._4_4_;
                    fStack_390 = (fStack_330 + -0.12420141) * (float)uStack_720;
                    fStack_38c = (fStack_32c + -0.12420141) * uStack_720._4_4_;
                    local_3a8[0] = 0.14249323;
                    local_3a8[1] = 0.14249323;
                    afStack_3a0[0] = 0.14249323;
                    afStack_3a0[1] = 0.14249323;
                    local_7d8 = CONCAT44(fStack_394 + 0.14249323,local_398 + 0.14249323);
                    uStack_7d0 = CONCAT44(fStack_38c + 0.14249323,fStack_390 + 0.14249323);
                    local_410 = &local_7d8;
                    local_418 = &local_758;
                    local_420 = ::_ps_cephes_log_p5;
                    local_3d8 = local_7d8;
                    uStack_3d0 = uStack_7d0;
                    local_3e8 = local_758;
                    uStack_3e0 = uStack_750;
                    local_3f8 = (local_398 + 0.14249323) * (float)local_728;
                    fStack_3f4 = (fStack_394 + 0.14249323) * local_728._4_4_;
                    fStack_3f0 = (fStack_390 + 0.14249323) * (float)uStack_720;
                    fStack_3ec = (fStack_38c + 0.14249323) * uStack_720._4_4_;
                    local_408[0] = -0.16668057;
                    local_408[1] = -0.16668057;
                    afStack_400[0] = -0.16668057;
                    afStack_400[1] = -0.16668057;
                    local_7d8 = CONCAT44(fStack_3f4 + -0.16668057,local_3f8 + -0.16668057);
                    uStack_7d0 = CONCAT44(fStack_3ec + -0.16668057,fStack_3f0 + -0.16668057);
                    local_470 = &local_7d8;
                    local_478 = &local_758;
                    local_480 = ::_ps_cephes_log_p6;
                    local_438 = local_7d8;
                    uStack_430 = uStack_7d0;
                    local_448 = local_758;
                    uStack_440 = uStack_750;
                    local_458 = (local_3f8 + -0.16668057) * (float)local_728;
                    fStack_454 = (fStack_3f4 + -0.16668057) * local_728._4_4_;
                    fStack_450 = (fStack_3f0 + -0.16668057) * (float)uStack_720;
                    fStack_44c = (fStack_3ec + -0.16668057) * uStack_720._4_4_;
                    local_468[0] = 0.20000714;
                    local_468[1] = 0.20000714;
                    afStack_460[0] = 0.20000714;
                    afStack_460[1] = 0.20000714;
                    local_7d8 = CONCAT44(fStack_454 + 0.20000714,local_458 + 0.20000714);
                    uStack_7d0 = CONCAT44(fStack_44c + 0.20000714,fStack_450 + 0.20000714);
                    local_4d0 = &local_7d8;
                    local_4d8 = &local_758;
                    local_4e0 = ::_ps_cephes_log_p7;
                    local_498 = local_7d8;
                    uStack_490 = uStack_7d0;
                    local_4a8 = local_758;
                    uStack_4a0 = uStack_750;
                    local_4b8 = (local_458 + 0.20000714) * (float)local_728;
                    fStack_4b4 = (fStack_454 + 0.20000714) * local_728._4_4_;
                    fStack_4b0 = (fStack_450 + 0.20000714) * (float)uStack_720;
                    fStack_4ac = (fStack_44c + 0.20000714) * uStack_720._4_4_;
                    local_4c8[0] = -0.24999994;
                    local_4c8[1] = -0.24999994;
                    afStack_4c0[0] = -0.24999994;
                    afStack_4c0[1] = -0.24999994;
                    local_7d8 = CONCAT44(fStack_4b4 + -0.24999994,local_4b8 + -0.24999994);
                    uStack_7d0 = CONCAT44(fStack_4ac + -0.24999994,fStack_4b0 + -0.24999994);
                    local_530 = &local_7d8;
                    local_538 = &local_758;
                    local_540 = ::_ps_cephes_log_p8;
                    local_4f8 = local_7d8;
                    uStack_4f0 = uStack_7d0;
                    local_508 = local_758;
                    uStack_500 = uStack_750;
                    local_518 = (local_4b8 + -0.24999994) * (float)local_728;
                    fStack_514 = (fStack_4b4 + -0.24999994) * local_728._4_4_;
                    fStack_510 = (fStack_4b0 + -0.24999994) * (float)uStack_720;
                    fStack_50c = (fStack_4ac + -0.24999994) * uStack_720._4_4_;
                    local_528[0] = 0.3333333;
                    local_528[1] = 0.3333333;
                    afStack_520[0] = 0.3333333;
                    afStack_520[1] = 0.3333333;
                    local_7d8 = CONCAT44(fStack_514 + 0.3333333,local_518 + 0.3333333);
                    uStack_7d0 = CONCAT44(fStack_50c + 0.3333333,fStack_510 + 0.3333333);
                    local_6b8 = local_7d8;
                    uStack_6b0 = uStack_7d0;
                    local_6c8 = local_758;
                    uStack_6c0 = uStack_750;
                    fVar37 = (local_518 + 0.3333333) * (float)local_728;
                    fVar41 = (fStack_514 + 0.3333333) * local_728._4_4_;
                    fVar45 = (fStack_510 + 0.3333333) * (float)uStack_720;
                    fVar49 = (fStack_50c + 0.3333333) * uStack_720._4_4_;
                    local_7d8 = CONCAT44(fVar41,fVar37);
                    uStack_7d0 = CONCAT44(fVar49,fVar45);
                    local_6e8 = CONCAT44(fStack_7c4,local_7c8);
                    uStack_6e0 = CONCAT44(fStack_7bc,fStack_7c0);
                    local_6d8 = local_7d8;
                    uStack_6d0 = uStack_7d0;
                    fVar37 = fVar37 * local_7c8;
                    fVar41 = fVar41 * fStack_7c4;
                    fVar45 = fVar45 * fStack_7c0;
                    fVar49 = fVar49 * fStack_7bc;
                    local_7d8 = CONCAT44(fVar41,fVar37);
                    uStack_7d0 = CONCAT44(fVar49,fVar45);
                    local_590 = &local_798;
                    local_598 = ::_ps_cephes_log_q1;
                    local_5a0 = &local_7d8;
                    local_558 = CONCAT44(fStack_794,local_798);
                    uStack_550 = CONCAT44(fStack_78c,fStack_790);
                    local_568[0] = -0.00021219444;
                    local_568[1] = -0.00021219444;
                    afStack_560[0] = -0.00021219444;
                    afStack_560[1] = -0.00021219444;
                    local_578 = local_798 * -0.00021219444;
                    fStack_574 = fStack_794 * -0.00021219444;
                    fStack_570 = fStack_790 * -0.00021219444;
                    fStack_56c = fStack_78c * -0.00021219444;
                    local_588 = local_7d8;
                    uStack_580 = uStack_7d0;
                    fVar37 = local_578 + fVar37;
                    fVar41 = fStack_574 + fVar41;
                    fVar45 = fStack_570 + fVar45;
                    fVar49 = fStack_56c + fVar49;
                    local_7d8 = CONCAT44(fVar41,fVar37);
                    uStack_7d0 = CONCAT44(fVar49,fVar45);
                    local_1d0 = &local_7c8;
                    local_1d8 = ::_ps_0p5;
                    local_1e0 = &local_7d8;
                    local_198 = local_7d8;
                    uStack_190 = uStack_7d0;
                    local_1b8 = CONCAT44(fStack_7c4,local_7c8);
                    uStack_1b0 = CONCAT44(fStack_7bc,fStack_7c0);
                    local_1c8[0] = 0.5;
                    local_1c8[1] = 0.5;
                    afStack_1c0[0] = 0.5;
                    afStack_1c0[1] = 0.5;
                    local_1a8 = local_7c8 * 0.5;
                    fStack_1a4 = fStack_7c4 * 0.5;
                    fStack_1a0 = fStack_7c0 * 0.5;
                    fStack_19c = fStack_7bc * 0.5;
                    fVar37 = fVar37 - local_1a8;
                    fVar41 = fVar41 - fStack_1a4;
                    fVar45 = fVar45 - fStack_1a0;
                    fVar49 = fVar49 - fStack_19c;
                    local_7d8 = CONCAT44(fVar41,fVar37);
                    uStack_7d0 = CONCAT44(fVar49,fVar45);
                    local_738 = local_758;
                    uStack_730 = uStack_750;
                    local_748 = local_7d8;
                    uStack_740 = uStack_7d0;
                    local_728._0_4_ = (float)local_728 + fVar37;
                    local_728._4_4_ = local_728._4_4_ + fVar41;
                    uStack_720._0_4_ = (float)uStack_720 + fVar45;
                    uStack_720._4_4_ = uStack_720._4_4_ + fVar49;
                    local_758 = CONCAT44(local_728._4_4_,(float)local_728);
                    uStack_750._0_4_ = (float)uStack_720;
                    uStack_750._4_4_ = uStack_720._4_4_;
                    local_5f0 = &local_798;
                    local_5f8 = ::_ps_cephes_log_q2;
                    local_600 = &local_758;
                    local_5b8 = CONCAT44(fStack_794,local_798);
                    uStack_5b0 = CONCAT44(fStack_78c,fStack_790);
                    local_5c8[0] = 0.6933594;
                    local_5c8[1] = 0.6933594;
                    afStack_5c0[0] = 0.6933594;
                    afStack_5c0[1] = 0.6933594;
                    local_5d8 = local_798 * 0.6933594;
                    fStack_5d4 = fStack_794 * 0.6933594;
                    fStack_5d0 = fStack_790 * 0.6933594;
                    fStack_5cc = fStack_78c * 0.6933594;
                    local_5e8 = local_758;
                    uStack_5e0 = uStack_750;
                    local_758 = CONCAT44(fStack_5d4 + local_728._4_4_,local_5d8 + (float)local_728);
                    uStack_750._0_4_ = fStack_5d0 + (float)uStack_720;
                    uStack_750._4_4_ = fStack_5cc + uStack_720._4_4_;
                    local_138 = CONCAT44(iStack_784,local_788);
                    uStack_130 = CONCAT44(iStack_77c,iStack_780);
                    local_128 = local_758;
                    uStack_120 = uStack_750;
                    local_758 = local_758 | local_138;
                    uStack_750 = uStack_750 | uStack_130;
                    local_928 = 0x3f8000003f800000;
                    uStack_920 = 0x3f8000003f800000;
                    local_e08 = (float)local_758;
                    fStack_e04 = (float)(local_758 >> 0x20);
                    fStack_e00 = (float)uStack_750;
                    fStack_dfc = (float)(uStack_750 >> 0x20);
                    local_948 = CONCAT44(fStack_e04 * 2.0,local_e08 * 2.0);
                    uStack_940 = CONCAT44(fStack_dfc * 2.0,fStack_e00 * 2.0);
                    local_938 = 0;
                    uStack_930 = 0;
                    local_cf8 = CONCAT44(0.0 - fStack_e04 * 2.0,0.0 - local_e08 * 2.0);
                    uStack_cf0._0_4_ = 0.0 - fStack_e00 * 2.0;
                    uStack_cf0._4_4_ = 0.0 - fStack_dfc * 2.0;
                    local_c28 = 0;
                    uStack_c20 = 0;
                    local_d38 = 0x3f8000003f800000;
                    uStack_d30 = 0x3f8000003f800000;
                    local_978 = local_cf8;
                    uStack_970 = uStack_cf0;
                    local_988 = 0x42b0c0a542b0c0a5;
                    uStack_980 = 0x42b0c0a542b0c0a5;
                    auVar22._8_8_ = uStack_cf0;
                    auVar22._0_8_ = local_cf8;
                    auVar21._8_8_ = 0x42b0c0a542b0c0a5;
                    auVar21._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar40 = minps(auVar22,auVar21);
                    local_cf8 = auVar40._0_8_;
                    uStack_cf0 = auVar40._8_8_;
                    local_998 = local_cf8;
                    uStack_990 = uStack_cf0;
                    local_9a8 = 0xc2b0c0a5c2b0c0a5;
                    uStack_9a0 = 0xc2b0c0a5c2b0c0a5;
                    auVar20._8_8_ = 0xc2b0c0a5c2b0c0a5;
                    auVar20._0_8_ = 0xc2b0c0a5c2b0c0a5;
                    auVar40 = maxps(auVar40,auVar20);
                    local_cf8 = auVar40._0_8_;
                    uStack_cf0 = auVar40._8_8_;
                    local_c58 = local_cf8;
                    uVar27 = local_c58;
                    uStack_c50 = uStack_cf0;
                    uVar28 = uStack_c50;
                    local_c68 = 0x3fb8aa3b3fb8aa3b;
                    uStack_c60 = 0x3fb8aa3b3fb8aa3b;
                    local_c58._0_4_ = auVar40._0_4_;
                    local_c58._4_4_ = auVar40._4_4_;
                    uStack_c50._0_4_ = auVar40._8_4_;
                    uStack_c50._4_4_ = auVar40._12_4_;
                    local_cb8 = CONCAT44(local_c58._4_4_ * 1.442695,(float)local_c58 * 1.442695);
                    uStack_cb0 = CONCAT44(uStack_c50._4_4_ * 1.442695,(float)uStack_c50 * 1.442695);
                    local_cc8 = 0x3f0000003f000000;
                    uStack_cc0 = 0x3f0000003f000000;
                    fVar37 = (float)local_c58 * 1.442695 + 0.5;
                    fVar41 = local_c58._4_4_ * 1.442695 + 0.5;
                    fVar45 = (float)uStack_c50 * 1.442695 + 0.5;
                    fVar49 = uStack_c50._4_4_ * 1.442695 + 0.5;
                    local_8f8 = CONCAT44(fVar41,fVar37);
                    uStack_8f0 = CONCAT44(fVar49,fVar45);
                    local_bf8 = CONCAT44((int)fVar41,(int)fVar37);
                    uStack_bf0 = CONCAT44((int)fVar49,(int)fVar45);
                    local_d18 = (float)(int)fVar37;
                    fStack_d14 = (float)(int)fVar41;
                    fStack_d10 = (float)(int)fVar45;
                    fStack_d0c = (float)(int)fVar49;
                    local_d08 = CONCAT44(fStack_d14,local_d18);
                    uStack_d00 = CONCAT44(fStack_d0c,fStack_d10);
                    local_8e8 = CONCAT44(fVar41,fVar37);
                    uStack_8e0 = CONCAT44(fVar49,fVar45);
                    local_8d8 = local_d08;
                    uStack_8d0 = uStack_d00;
                    local_d48 = CONCAT44(-(uint)(fVar41 < fStack_d14),-(uint)(fVar37 < local_d18));
                    uStack_d40 = CONCAT44(-(uint)(fVar49 < fStack_d0c),-(uint)(fVar45 < fStack_d10))
                    ;
                    local_c08 = local_d48;
                    uStack_c00 = uStack_d40;
                    local_c18 = 0x3f8000003f800000;
                    uStack_c10 = 0x3f8000003f800000;
                    local_d48 = local_d48 & 0x3f8000003f800000;
                    uStack_d40 = uStack_d40 & 0x3f8000003f800000;
                    local_958 = local_d08;
                    uStack_950 = uStack_d00;
                    local_968._0_4_ = (float)local_d48;
                    local_968._4_4_ = (float)(local_d48 >> 0x20);
                    uStack_960._0_4_ = (float)uStack_d40;
                    uStack_960._4_4_ = (float)(uStack_d40 >> 0x20);
                    local_d18 = local_d18 - (float)local_968;
                    fStack_d14 = fStack_d14 - local_968._4_4_;
                    fStack_d10 = fStack_d10 - (float)uStack_960;
                    fStack_d0c = fStack_d0c - uStack_960._4_4_;
                    local_8b0 = &local_d18;
                    local_858 = ::_ps_cephes_exp_C1;
                    local_be0 = &local_cf8;
                    local_818 = local_cf8;
                    uStack_810 = uStack_cf0;
                    local_838 = CONCAT44(fStack_d14,local_d18);
                    uStack_830 = CONCAT44(fStack_d0c,fStack_d10);
                    local_848[0] = 0.6933594;
                    local_848[1] = 0.6933594;
                    afStack_840[0] = 0.6933594;
                    afStack_840[1] = 0.6933594;
                    local_828 = local_d18 * 0.6933594;
                    fStack_824 = fStack_d14 * 0.6933594;
                    fStack_820 = fStack_d10 * 0.6933594;
                    fStack_81c = fStack_d0c * 0.6933594;
                    local_cf8 = CONCAT44(local_c58._4_4_ - fStack_824,(float)local_c58 - local_828);
                    uStack_cf0._0_4_ = (float)uStack_c50 - fStack_820;
                    uStack_cf0._4_4_ = uStack_c50._4_4_ - fStack_81c;
                    local_8b8 = ::_ps_cephes_exp_C2;
                    local_878 = local_cf8;
                    uStack_870 = uStack_cf0;
                    local_898 = CONCAT44(fStack_d14,local_d18);
                    uStack_890 = CONCAT44(fStack_d0c,fStack_d10);
                    local_8a8[0] = -0.00021219444;
                    local_8a8[1] = -0.00021219444;
                    afStack_8a0[0] = -0.00021219444;
                    afStack_8a0[1] = -0.00021219444;
                    local_888 = local_d18 * -0.00021219444;
                    fStack_884 = fStack_d14 * -0.00021219444;
                    fStack_880 = fStack_d10 * -0.00021219444;
                    fStack_87c = fStack_d0c * -0.00021219444;
                    fVar37 = ((float)local_c58 - local_828) - local_888;
                    fVar41 = (local_c58._4_4_ - fStack_824) - fStack_884;
                    fVar45 = ((float)uStack_c50 - fStack_820) - fStack_880;
                    fVar49 = (uStack_c50._4_4_ - fStack_81c) - fStack_87c;
                    local_cf8 = CONCAT44(fVar41,fVar37);
                    uStack_cf0._0_4_ = fVar45;
                    uStack_cf0._4_4_ = fVar49;
                    local_c78 = local_cf8;
                    uStack_c70 = uStack_cf0;
                    local_c88 = local_cf8;
                    uStack_c80 = uStack_cf0;
                    local_d08 = CONCAT44(fVar41 * fVar41,fVar37 * fVar37);
                    uStack_d00 = CONCAT44(fVar49 * fVar49,fVar45 * fVar45);
                    local_bd0 = &local_d58;
                    local_a00 = ::_ps_cephes_exp_p1;
                    local_9b8 = 0x3950696739506967;
                    uStack_9b0 = 0x3950696739506967;
                    local_9c8 = local_cf8;
                    uStack_9c0 = uStack_cf0;
                    local_9d8 = fVar37 * 0.00019875691;
                    fStack_9d4 = fVar41 * 0.00019875691;
                    fStack_9d0 = fVar45 * 0.00019875691;
                    fStack_9cc = fVar49 * 0.00019875691;
                    local_9e8[0] = 0.0013981999;
                    local_9e8[1] = 0.0013981999;
                    afStack_9e0[0] = 0.0013981999;
                    afStack_9e0[1] = 0.0013981999;
                    local_d58 = CONCAT44(fStack_9d4 + 0.0013981999,local_9d8 + 0.0013981999);
                    uStack_d50 = CONCAT44(fStack_9cc + 0.0013981999,fStack_9d0 + 0.0013981999);
                    local_a60 = ::_ps_cephes_exp_p2;
                    local_a18 = local_d58;
                    uStack_a10 = uStack_d50;
                    local_a28 = local_cf8;
                    uStack_a20 = uStack_cf0;
                    local_a38 = (local_9d8 + 0.0013981999) * fVar37;
                    fStack_a34 = (fStack_9d4 + 0.0013981999) * fVar41;
                    fStack_a30 = (fStack_9d0 + 0.0013981999) * fVar45;
                    fStack_a2c = (fStack_9cc + 0.0013981999) * fVar49;
                    local_a48[0] = 0.008333452;
                    local_a48[1] = 0.008333452;
                    afStack_a40[0] = 0.008333452;
                    afStack_a40[1] = 0.008333452;
                    local_d58 = CONCAT44(fStack_a34 + 0.008333452,local_a38 + 0.008333452);
                    uStack_d50 = CONCAT44(fStack_a2c + 0.008333452,fStack_a30 + 0.008333452);
                    local_ac0 = ::_ps_cephes_exp_p3;
                    local_a78 = local_d58;
                    uStack_a70 = uStack_d50;
                    local_a88 = local_cf8;
                    uStack_a80 = uStack_cf0;
                    local_a98 = (local_a38 + 0.008333452) * fVar37;
                    fStack_a94 = (fStack_a34 + 0.008333452) * fVar41;
                    fStack_a90 = (fStack_a30 + 0.008333452) * fVar45;
                    fStack_a8c = (fStack_a2c + 0.008333452) * fVar49;
                    local_aa8[0] = 0.041665796;
                    local_aa8[1] = 0.041665796;
                    afStack_aa0[0] = 0.041665796;
                    afStack_aa0[1] = 0.041665796;
                    local_d58 = CONCAT44(fStack_a94 + 0.041665796,local_a98 + 0.041665796);
                    uStack_d50 = CONCAT44(fStack_a8c + 0.041665796,fStack_a90 + 0.041665796);
                    local_b20 = ::_ps_cephes_exp_p4;
                    local_ad8 = local_d58;
                    uStack_ad0 = uStack_d50;
                    local_ae8 = local_cf8;
                    uStack_ae0 = uStack_cf0;
                    local_af8 = (local_a98 + 0.041665796) * fVar37;
                    fStack_af4 = (fStack_a94 + 0.041665796) * fVar41;
                    fStack_af0 = (fStack_a90 + 0.041665796) * fVar45;
                    fStack_aec = (fStack_a8c + 0.041665796) * fVar49;
                    local_b08[0] = 0.16666666;
                    local_b08[1] = 0.16666666;
                    afStack_b00[0] = 0.16666666;
                    afStack_b00[1] = 0.16666666;
                    local_d58 = CONCAT44(fStack_af4 + 0.16666666,local_af8 + 0.16666666);
                    uStack_d50 = CONCAT44(fStack_aec + 0.16666666,fStack_af0 + 0.16666666);
                    local_b80 = ::_ps_cephes_exp_p5;
                    local_b38 = local_d58;
                    uStack_b30 = uStack_d50;
                    local_b48 = local_cf8;
                    uStack_b40 = uStack_cf0;
                    local_b58 = (local_af8 + 0.16666666) * fVar37;
                    fStack_b54 = (fStack_af4 + 0.16666666) * fVar41;
                    fStack_b50 = (fStack_af0 + 0.16666666) * fVar45;
                    fStack_b4c = (fStack_aec + 0.16666666) * fVar49;
                    local_b68[0] = 0.5;
                    local_b68[1] = 0.5;
                    afStack_b60[0] = 0.5;
                    afStack_b60[1] = 0.5;
                    local_d58 = CONCAT44(fStack_b54 + 0.5,local_b58 + 0.5);
                    uStack_d50 = CONCAT44(fStack_b4c + 0.5,fStack_b50 + 0.5);
                    local_bd8 = &local_d08;
                    local_b98 = local_d58;
                    uStack_b90 = uStack_d50;
                    local_ba8 = local_d08;
                    uStack_ba0 = uStack_d00;
                    local_bb8 = (local_b58 + 0.5) * fVar37 * fVar37;
                    fStack_bb4 = (fStack_b54 + 0.5) * fVar41 * fVar41;
                    fStack_bb0 = (fStack_b50 + 0.5) * fVar45 * fVar45;
                    fStack_bac = (fStack_b4c + 0.5) * fVar49 * fVar49;
                    local_bc8 = local_cf8;
                    uStack_bc0 = uStack_cf0;
                    local_d58 = CONCAT44(fStack_bb4 + fVar41,local_bb8 + fVar37);
                    uStack_d50 = CONCAT44(fStack_bac + fVar49,fStack_bb0 + fVar45);
                    local_cd8 = local_d58;
                    uStack_cd0 = uStack_d50;
                    local_ce8 = 0x3f8000003f800000;
                    uStack_ce0 = 0x3f8000003f800000;
                    fVar37 = local_bb8 + fVar37 + 1.0;
                    fVar41 = fStack_bb4 + fVar41 + 1.0;
                    fVar45 = fStack_bb0 + fVar45 + 1.0;
                    fVar49 = fStack_bac + fVar49 + 1.0;
                    local_d58 = CONCAT44(fVar41,fVar37);
                    uStack_d50 = CONCAT44(fVar49,fVar45);
                    local_908 = CONCAT44(fStack_d14,local_d18);
                    uStack_900 = CONCAT44(fStack_d0c,fStack_d10);
                    local_c38 = CONCAT44((int)fStack_d14,(int)local_d18);
                    uStack_c30 = CONCAT44((int)fStack_d0c,(int)fStack_d10);
                    local_c48 = 0x7f0000007f;
                    uStack_c40 = 0x7f0000007f;
                    iVar38 = (int)local_d18 + 0x7f;
                    fStack_d24 = (float)((int)fStack_d14 + 0x7f);
                    fStack_d20 = (float)((int)fStack_d10 + 0x7f);
                    fStack_d1c = (float)((int)fStack_d0c + 0x7f);
                    local_7f8 = CONCAT44(fStack_d24,iVar38);
                    uStack_7f0 = CONCAT44(fStack_d1c,fStack_d20);
                    local_7fc = 0x17;
                    local_d28 = (float)(iVar38 * 0x800000);
                    local_ca8 = CONCAT44(fStack_d24,local_d28);
                    uStack_ca0 = CONCAT44(fStack_d1c,fStack_d20);
                    local_c98 = local_d58;
                    uStack_c90 = uStack_d50;
                    fVar37 = fVar37 * local_d28;
                    fVar41 = fVar41 * fStack_d24;
                    fVar45 = fVar45 * fStack_d20;
                    fVar49 = fVar49 * fStack_d1c;
                    local_d58 = CONCAT44(fVar41,fVar37);
                    uStack_d50 = CONCAT44(fVar49,fVar45);
                    auVar19._8_8_ = 0x3f8000003f800000;
                    auVar19._0_8_ = 0x3f8000003f800000;
                    auVar18._4_4_ = fVar41 + 1.0;
                    auVar18._0_4_ = fVar37 + 1.0;
                    auVar18._8_4_ = fVar45 + 1.0;
                    auVar18._12_4_ = fVar49 + 1.0;
                    auVar40 = divps(auVar19,auVar18);
                    local_e28 = auVar40._0_4_;
                    fStack_e24 = auVar40._4_4_;
                    fStack_e20 = auVar40._8_4_;
                    fStack_e1c = auVar40._12_4_;
                    local_918 = local_e28 * 2.0;
                    fStack_914 = fStack_e24 * 2.0;
                    fStack_910 = fStack_e20 * 2.0;
                    fStack_90c = fStack_e1c * 2.0;
                    auVar40._4_4_ = fStack_2054 * (fStack_914 - 1.0);
                    auVar40._0_4_ = local_2058 * (local_918 - 1.0);
                    auVar40._12_4_ = fStack_204c * (fStack_90c - 1.0);
                    auVar40._8_4_ = fStack_2050 * (fStack_910 - 1.0);
                    local_1878 = local_1888;
                    uStack_1870 = uStack_1880;
                    local_1858 = uVar25;
                    uStack_1850 = uVar26;
                    local_17c8 = local_1888;
                    uStack_17c0 = uStack_1880;
                    local_1778 = local_17e0;
                    local_1770 = local_17d0;
                    local_1748 = local_1888;
                    uStack_1740 = uStack_1880;
                    local_1718 = local_17e0;
                    local_1710 = local_17d0;
                    local_c58 = uVar27;
                    uStack_c50 = uVar28;
                    local_b78 = local_be0;
                    local_b70 = local_bd0;
                    local_b18 = local_be0;
                    local_b10 = local_bd0;
                    local_ab8 = local_be0;
                    local_ab0 = local_bd0;
                    local_a58 = local_be0;
                    local_a50 = local_bd0;
                    local_9f8 = local_be0;
                    local_9f0 = local_bd0;
                    local_968 = local_d48;
                    uStack_960 = uStack_d40;
                    local_8c0 = local_be0;
                    local_860 = local_be0;
                    local_850 = local_8b0;
                    local_7e8 = local_ca8;
                    uStack_7e0 = uStack_ca0;
                    local_728 = local_7b8;
                    uStack_720 = uStack_7b0;
                    local_228 = uVar39;
                    uStack_220 = uVar46;
                    local_1f8 = local_648;
                    uStack_1f0 = uStack_640;
                    local_158 = uVar29;
                    uStack_150 = uVar30;
                    local_c8 = local_648;
                    uStack_c0 = uStack_640;
                    break;
                  case 6:
                    fVar37 = *(float *)*plVar1;
                    fVar41 = *(float *)(*plVar1 + 4);
                    local_1a88 = CONCAT44(fStack_2054 * fVar37 + fVar41,local_2058 * fVar37 + fVar41
                                         );
                    uStack_1a80._0_4_ = fStack_2050 * fVar37 + fVar41;
                    uStack_1a80._4_4_ = fStack_204c * fVar37 + fVar41;
                    auVar50._8_8_ = uStack_1a80;
                    auVar50._0_8_ = local_1a88;
                    auVar40 = maxps(auVar50,ZEXT816(0));
                    auVar10._8_8_ = 0x3f8000003f800000;
                    auVar10._0_8_ = 0x3f8000003f800000;
                    auVar40 = minps(auVar40,auVar10);
                    local_1a08 = auVar40._0_4_;
                    fStack_1a04 = auVar40._4_4_;
                    fStack_1a00 = auVar40._8_4_;
                    fStack_19fc = auVar40._12_4_;
                    auVar40._4_4_ = fStack_1a04 * fStack_2054;
                    auVar40._0_4_ = local_1a08 * local_2058;
                    auVar40._12_4_ = fStack_19fc * fStack_204c;
                    auVar40._8_4_ = fStack_1a00 * fStack_2050;
                    break;
                  default:
                    auVar40._8_8_ = uStack_2470;
                    auVar40._0_8_ = local_2478;
                  }
                  local_2478 = auVar40._0_8_;
                  uStack_2470 = auVar40._8_8_;
                  puVar34 = (undefined8 *)((long)local_23c0 + (long)(local_2460 << 2) * 4);
                  *puVar34 = local_2478;
                  puVar34[1] = uStack_2470;
                }
                local_23c0 = (void *)((long)local_23c0 + (long)(local_235c << 2) * 4);
              }
              local_2458 = 0;
              local_2448 = 0;
              local_2440 = 0;
              local_2430 = 0;
              local_242c = 0;
              local_2428 = 0;
              local_2424 = 0;
              local_2420 = 0;
              local_2418 = 0;
              local_2450 = 0;
            }
            local_22b4 = 0;
            local_2358 = 1;
            std::vector<int,_std::allocator<int>_>::~vector
                      ((vector<int,_std::allocator<int>_> *)
                       CONCAT44(in_stack_ffffffffffffd684,in_stack_ffffffffffffd680));
          }
          goto LAB_0125f07b;
        }
        if (iVar38 == 1) {
          if ((((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 3) &&
               (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) == 3)) &&
              (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) == 1)) &&
             (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 1 &&
               (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 1)) &&
              (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) == 1)))) {
            convdw3x3s1_sse(in_stack_ffffffffffffd820,in_stack_ffffffffffffd818,
                            (Mat *)CONCAT44(in_stack_ffffffffffffd814,in_stack_ffffffffffffd810),
                            (Mat *)CONCAT44(in_stack_ffffffffffffd80c,in_stack_ffffffffffffd808),
                            (Option *)in_stack_ffffffffffffd800);
            if (in_RDI[1] != 0) {
              (**(code **)(*(long *)in_RDI[1] + 0x48))((long *)in_RDI[1],in_RDX,in_RCX);
            }
            local_22b4 = 0;
            local_2358 = 1;
            goto LAB_0125f07b;
          }
          if (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 3) &&
              (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) == 3)) &&
             ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) == 1 &&
              (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 1 &&
                (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 2)) &&
               (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) == 2)))))) {
            convdw3x3s2_sse((Mat *)CONCAT44(in_stack_ffffffffffffd814,in_stack_ffffffffffffd810),
                            (Mat *)CONCAT44(in_stack_ffffffffffffd80c,in_stack_ffffffffffffd808),
                            in_stack_ffffffffffffd800,in_stack_ffffffffffffd7f8,local_2818);
            if (in_RDI[1] != 0) {
              (**(code **)(*(long *)in_RDI[1] + 0x48))((long *)in_RDI[1],in_RDX,in_RCX);
            }
            local_22b4 = 0;
            local_2358 = 1;
            goto LAB_0125f07b;
          }
        }
      }
      local_24ac = (iVar31 * iVar38) / *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x108);
      local_24b0 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) /
                   *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x108);
      local_24b4 = 1;
      local_24b8 = 1;
      if ((*(byte *)((long)in_RCX + 0x27) & 1) != 0) {
        local_24b4 = 1;
        if (local_24ac % 4 == 0) {
          local_24b4 = 4;
        }
        local_24b8 = 1;
        if (local_24b0 % 4 == 0) {
          local_24b8 = 4;
        }
      }
      local_98 = &local_2500;
      local_2500 = local_2348;
      local_24f8 = local_2340;
      local_24f0 = local_2338;
      local_24e8 = local_2330;
      local_24e0 = local_2328;
      local_24d8 = local_2320;
      local_24d4 = local_231c;
      local_24d0 = local_2318;
      local_24cc = local_2314;
      local_24c8 = SUB84(in_stack_ffffffffffffdcf0,0);
      if (local_2340 != (int *)0x0) {
        local_9c = 1;
        LOCK();
        local_a0 = *local_2340;
        *local_2340 = *local_2340 + 1;
        UNLOCK();
      }
      local_24c0 = _bias;
      if (local_24b4 < iVar38) {
        local_2548 = *in_RCX;
        local_2538 = in_RCX[2];
        uStack_2530 = in_RCX[3];
        local_2528 = in_RCX[4];
        uStack_2520 = in_RCX[5];
        local_2518 = in_RCX[6];
        uStack_2510 = in_RCX[7];
        uStack_2540 = in_RCX[2];
        convert_packing(in_stack_ffffffffffffd6b0,in_stack_ffffffffffffd6a8,
                        (int)((ulong)in_stack_ffffffffffffd6a0 >> 0x20),in_stack_ffffffffffffd698);
      }
      local_a8 = &local_2590;
      local_2590 = *in_RDX;
      local_2588 = (int *)in_RDX[1];
      local_2580 = in_RDX[2];
      local_2578 = *(undefined4 *)(in_RDX + 3);
      local_2570 = (long *)in_RDX[4];
      local_2568 = *(undefined4 *)(in_RDX + 5);
      local_2564 = *(int *)((long)in_RDX + 0x2c);
      local_2560 = *(int *)(in_RDX + 6);
      local_255c = *(int *)((long)in_RDX + 0x34);
      local_2558 = *(int *)(in_RDX + 7);
      local_2550 = in_RDX[8];
      if (local_2588 != (int *)0x0) {
        local_ac = 1;
        LOCK();
        local_b0 = *local_2588;
        *local_2588 = *local_2588 + 1;
        UNLOCK();
      }
      if ((local_24b8 < local_2364) &&
         (Mat::create(in_stack_ffffffffffffd6a0,(int)((ulong)in_stack_ffffffffffffd698 >> 0x20),
                      (int)in_stack_ffffffffffffd698,(int)((ulong)in_stack_ffffffffffffd690 >> 0x20)
                      ,in_stack_ffffffffffffd688,in_stack_ffffffffffffd684,
                      (Allocator *)CONCAT17(in_stack_ffffffffffffd707,in_stack_ffffffffffffd700)),
         local_2590 == (void *)0x0 || (long)local_2550 * (long)local_2558 == 0)) {
        local_22b4 = -100;
      }
      else {
        for (local_2594 = 0;
            local_2594 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x108);
            local_2594 = local_2594 + 1) {
          local_70 = local_24ac / local_24b4;
          local_78 = (void *)((long)local_2500 +
                             (long)local_24c0 * (long)((local_24ac * local_2594) / local_24b4) *
                             local_24f0);
          local_60 = &local_25e0;
          local_25d8 = (int *)0x0;
          local_25d0 = local_24f0;
          local_25c8 = local_24e8;
          local_25c0 = local_24e0;
          local_25b4 = local_24d4;
          local_25b0 = local_24d0;
          local_25ac = local_24cc;
          local_50 = (long)local_24d4 * (long)local_24d0 * (long)local_24cc * local_24f0;
          local_25a0 = (local_50 + 0xfU & 0xfffffffffffffff0) / local_24f0;
          local_28 = local_24b0 / local_24b8;
          local_30 = (void *)((long)local_2590 +
                             (long)local_2550 * (long)((local_24b0 * local_2594) / local_24b8) *
                             (long)local_2580);
          local_18 = &local_2628;
          local_2620 = (int *)0x0;
          local_2618 = local_2580;
          local_2610 = local_2578;
          local_2608 = local_2570;
          local_25fc = local_2564;
          local_25f8 = local_2560;
          local_25f4 = local_255c;
          local_8 = (long)local_2564 * (long)local_2560 * (long)local_255c * (long)local_2580;
          local_25e8 = (local_8 + 0xfU & 0xfffffffffffffff0) / (ulong)local_2580;
          local_c = 0x10;
          local_1c = local_2564;
          local_20 = local_2560;
          local_24 = local_255c;
          local_38 = local_2580;
          local_3c = local_2578;
          local_54 = 0x10;
          local_64 = local_24d4;
          local_68 = local_24d0;
          local_6c = local_24cc;
          local_80 = local_24f0;
          local_84 = local_24e8;
          local_90 = local_24e0;
          local_25b8 = local_24d8;
          local_2600 = local_2568;
          local_2628 = local_30;
          local_25f0 = local_28;
          local_25e0 = local_78;
          local_25a8 = local_70;
          ppLVar35 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                               ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                                (in_RDI + 2),(long)local_2594);
          local_2630 = *ppLVar35;
          local_2678 = *in_RCX;
          local_2668 = in_RCX[2];
          uStack_2660 = in_RCX[3];
          local_2658 = *(undefined4 *)(in_RCX + 4);
          uStack_2654 = *(undefined4 *)((long)in_RCX + 0x24);
          uStack_2650 = *(undefined4 *)(in_RCX + 5);
          uStack_264c = *(undefined4 *)((long)in_RCX + 0x2c);
          local_2648 = in_RCX[6];
          uStack_2640 = in_RCX[7];
          plStack_2670 = local_2570;
          (*local_2630->_vptr_Layer[7])(local_2630,&local_25e0,&local_2628,&local_2678);
          if (local_2620 != (int *)0x0) {
            LOCK();
            iVar31 = *local_2620;
            *local_2620 = *local_2620 + -1;
            UNLOCK();
            if (iVar31 == 1) {
              if (local_2608 == (long *)0x0) {
                if (local_2628 != (void *)0x0) {
                  free(local_2628);
                }
              }
              else {
                (**(code **)(*local_2608 + 0x18))(local_2608,local_2628);
              }
            }
          }
          local_2628 = (void *)0x0;
          local_2618 = (void *)0x0;
          local_2610 = 0;
          local_2600 = 0;
          local_25fc = 0;
          local_25f8 = 0;
          local_25f4 = 0;
          local_25f0 = 0;
          local_25e8 = 0;
          local_2620 = (int *)0x0;
          if (local_25d8 != (int *)0x0) {
            LOCK();
            iVar31 = *local_25d8;
            *local_25d8 = *local_25d8 + -1;
            UNLOCK();
            if (iVar31 == 1) {
              if (local_25c0 == (long *)0x0) {
                if (local_25e0 != (void *)0x0) {
                  free(local_25e0);
                }
              }
              else {
                (**(code **)(*local_25c0 + 0x18))(local_25c0,local_25e0);
              }
            }
          }
          local_25e0 = (void *)0x0;
          local_25d0 = 0;
          local_25c8 = 0;
          local_25b8 = 0;
          local_25b4 = 0;
          local_25b0 = 0;
          local_25ac = 0;
          local_25a8 = 0;
          local_25a0 = 0;
          local_25d8 = (int *)0x0;
        }
        if (local_24b8 < local_2364) {
          convert_packing(in_stack_ffffffffffffd6b0,in_stack_ffffffffffffd6a8,
                          (int)((ulong)in_stack_ffffffffffffd6a0 >> 0x20),in_stack_ffffffffffffd698)
          ;
        }
        else if (in_RDX != &local_2590) {
          if (local_2588 != (int *)0x0) {
            LOCK();
            *local_2588 = *local_2588 + 1;
            UNLOCK();
          }
          ppvVar51 = in_RDX;
          if (in_RDX[1] != (void *)0x0) {
            piVar2 = (int *)in_RDX[1];
            LOCK();
            iVar31 = *piVar2;
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (iVar31 == 1) {
              if (in_RDX[4] == (void *)0x0) {
                if (*in_RDX != (void *)0x0) {
                  free(*in_RDX);
                }
              }
              else {
                (**(code **)(*in_RDX[4] + 0x18))(in_RDX[4],*in_RDX);
              }
            }
          }
          *in_RDX = (void *)0x0;
          in_RDX[2] = (void *)0x0;
          *(undefined4 *)(in_RDX + 3) = 0;
          *(undefined4 *)(in_RDX + 5) = 0;
          *(undefined4 *)((long)in_RDX + 0x2c) = 0;
          *(undefined4 *)(in_RDX + 6) = 0;
          *(undefined4 *)((long)in_RDX + 0x34) = 0;
          *(undefined4 *)(in_RDX + 7) = 0;
          in_RDX[8] = (void *)0x0;
          in_RDX[1] = (void *)0x0;
          *ppvVar51 = local_2590;
          ppvVar51[1] = local_2588;
          ppvVar51[2] = local_2580;
          *(undefined4 *)(ppvVar51 + 3) = local_2578;
          ppvVar51[4] = local_2570;
          *(undefined4 *)(ppvVar51 + 5) = local_2568;
          *(int *)((long)ppvVar51 + 0x2c) = local_2564;
          *(int *)(ppvVar51 + 6) = local_2560;
          *(int *)((long)ppvVar51 + 0x34) = local_255c;
          *(int *)(ppvVar51 + 7) = local_2558;
          ppvVar51[8] = local_2550;
        }
        local_22b4 = 0;
      }
      local_2358 = 1;
      ppvVar51 = &local_2590;
      if (local_2588 != (int *)0x0) {
        LOCK();
        iVar31 = *local_2588;
        *local_2588 = *local_2588 + -1;
        UNLOCK();
        if (iVar31 == 1) {
          if (local_2570 == (long *)0x0) {
            if (local_2590 != (void *)0x0) {
              free(local_2590);
            }
          }
          else {
            (**(code **)(*local_2570 + 0x18))(local_2570,local_2590);
          }
        }
      }
      *ppvVar51 = (void *)0x0;
      ppvVar51[2] = (void *)0x0;
      *(undefined4 *)(ppvVar51 + 3) = 0;
      *(undefined4 *)(ppvVar51 + 5) = 0;
      *(undefined4 *)((long)ppvVar51 + 0x2c) = 0;
      *(undefined4 *)(ppvVar51 + 6) = 0;
      *(undefined4 *)((long)ppvVar51 + 0x34) = 0;
      *(undefined4 *)(ppvVar51 + 7) = 0;
      ppvVar51[8] = (void *)0x0;
      ppvVar51[1] = (void *)0x0;
      ppvVar51 = &local_2500;
      if (local_24f8 != (int *)0x0) {
        LOCK();
        iVar31 = *local_24f8;
        *local_24f8 = *local_24f8 + -1;
        UNLOCK();
        if (iVar31 == 1) {
          if (local_24e0 == (long *)0x0) {
            if (local_2500 != (void *)0x0) {
              free(local_2500);
            }
          }
          else {
            (**(code **)(*local_24e0 + 0x18))(local_24e0,local_2500);
          }
        }
      }
      *ppvVar51 = (void *)0x0;
      ppvVar51[2] = (void *)0x0;
      *(undefined4 *)(ppvVar51 + 3) = 0;
      *(undefined4 *)(ppvVar51 + 5) = 0;
      *(undefined4 *)((long)ppvVar51 + 0x2c) = 0;
      *(undefined4 *)(ppvVar51 + 6) = 0;
      *(undefined4 *)((long)ppvVar51 + 0x34) = 0;
      *(undefined4 *)(ppvVar51 + 7) = 0;
      ppvVar51[8] = (void *)0x0;
      ppvVar51[1] = (void *)0x0;
    }
  }
LAB_0125f07b:
  ppvVar51 = &local_2348;
  if (local_2340 != (int *)0x0) {
    LOCK();
    iVar31 = *local_2340;
    *local_2340 = *local_2340 + -1;
    UNLOCK();
    if (iVar31 == 1) {
      if (local_2328 == (long *)0x0) {
        if (local_2348 != (void *)0x0) {
          free(local_2348);
        }
      }
      else {
        (**(code **)(*local_2328 + 0x18))(local_2328,local_2348);
      }
    }
  }
  *ppvVar51 = (void *)0x0;
  ppvVar51[2] = (void *)0x0;
  *(undefined4 *)(ppvVar51 + 3) = 0;
  *(undefined4 *)(ppvVar51 + 5) = 0;
  *(undefined4 *)((long)ppvVar51 + 0x2c) = 0;
  *(undefined4 *)(ppvVar51 + 6) = 0;
  *(undefined4 *)((long)ppvVar51 + 0x34) = 0;
  *(undefined4 *)(ppvVar51 + 7) = 0;
  ppvVar51[8] = (void *)0x0;
  ppvVar51[1] = (void *)0x0;
  return local_22b4;
}

Assistant:

int ConvolutionDepthWise_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
#if NCNN_INT8
    if (opt.use_int8_inference && int8_scale_term)
    {
        return forward_int8_x86(bottom_blob, top_blob, opt);
    }
#endif

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // depth-wise
    if (channels * elempack == group && group == num_output)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw5x5s1_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw5x5s2_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            else
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 16;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m512 _sum = _mm512_set1_ps(0.f);

                            if (bias_term)
                            {
                                _sum = _mm512_loadu_ps(((const float*)bias_data) + g * 16);
                            }

                            const float* sptr = m.row(i * stride_h) + j * stride_w * 16;

                            for (int k = 0; k < maxk; k++)
                            {
                                __m512 _val = _mm512_loadu_ps(sptr + space_ofs[k] * 16);
                                __m512 _w = _mm512_loadu_ps(kptr + k * 16);
                                _sum = _mm512_fmadd_ps(_val, _w, _sum);
                            }

                            _mm512_storeu_ps(outptr, _sum);
                            outptr += 16;
                        }
                    }
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw5x5s1_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw5x5s2_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            else
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 8;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m256 _sum = _mm256_set1_ps(0.f);

                            if (bias_term)
                            {
                                _sum = _mm256_loadu_ps(((const float*)bias_data) + g * 8);
                            }

                            const float* sptr = m.row(i * stride_h) + j * stride_w * 8;

                            for (int k = 0; k < maxk; k++)
                            {
                                __m256 _val = _mm256_loadu_ps(sptr + space_ofs[k] * 8);
                                __m256 _w = _mm256_loadu_ps(kptr + k * 8);
                                _sum = _mm256_comp_fmadd_ps(_val, _w, _sum);
                            }

                            _mm256_storeu_ps(outptr + j * 8, _sum);
                        }

                        outptr += outw * 8;
                    }
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
        }
#endif // __AVX__

        if (elempack == 4)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw5x5s1_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw5x5s2_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 4;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m128 _sum = _mm_set1_ps(0.f);

                            if (bias_term)
                            {
                                _sum = _mm_loadu_ps(((const float*)bias_data) + g * 4);
                            }

                            const float* sptr = m.row(i * stride_h) + j * stride_w * 4;

                            for (int k = 0; k < maxk; k++)
                            {
                                __m128 _val = _mm_loadu_ps(sptr + space_ofs[k] * 4);
                                __m128 _w = _mm_loadu_ps(kptr + k * 4);
                                _sum = _mm_add_ps(_mm_mul_ps(_val, _w), _sum);
                            }

                            _sum = activation_sse(_sum, activation_type, activation_params);

                            _mm_storeu_ps(outptr + j * 4, _sum);
                        }

                        outptr += outw * 4;
                    }
                }

                return 0;
            }
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
        }
    }

    // group convolution
    const int channels_g = channels * elempack / group;
    const int num_output_g = num_output / group;

    int g_elempack = 1;
    int out_g_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        g_elempack = channels_g % 16 == 0 ? 16 : channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
        out_g_elempack = num_output_g % 16 == 0 ? 16 : num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#elif __AVX__
        g_elempack = channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
        out_g_elempack = num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#else
        g_elempack = channels_g % 4 == 0 ? 4 : 1;
        out_g_elempack = num_output_g % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    // unpacking
    Mat bottom_blob_bordered_unpacked = bottom_blob_bordered;
    if (elempack > g_elempack)
    {
        Option opt_p = opt;
        opt_p.blob_allocator = opt.workspace_allocator;
        convert_packing(bottom_blob_bordered, bottom_blob_bordered_unpacked, g_elempack, opt_p);
    }

    Mat top_blob_unpacked = top_blob;
    if (out_g_elempack < out_elempack)
    {
        top_blob_unpacked.create(outw, outh, num_output / out_g_elempack, out_elemsize / out_elempack * out_g_elempack, out_g_elempack, opt.workspace_allocator);
        if (top_blob_unpacked.empty())
            return -100;
    }

    for (int g = 0; g < group; g++)
    {
        const Mat bottom_blob_bordered_g = bottom_blob_bordered_unpacked.channel_range(channels_g * g / g_elempack, channels_g / g_elempack);
        Mat top_blob_g = top_blob_unpacked.channel_range(num_output_g * g / out_g_elempack, num_output_g / out_g_elempack);

        const ncnn::Layer* op = group_ops[g];

        Option opt_g = opt;
        opt_g.blob_allocator = top_blob_unpacked.allocator;

        // forward
        op->forward(bottom_blob_bordered_g, top_blob_g, opt_g);
    }

    // packing
    if (out_g_elempack < out_elempack)
    {
        convert_packing(top_blob_unpacked, top_blob, out_elempack, opt);
    }
    else
    {
        top_blob = top_blob_unpacked;
    }

    return 0;
}